

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::Convolution_x86_fma::forward
          (Convolution_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined8 uVar1;
  void *__ptr;
  undefined4 uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  Option *pOVar11;
  long lVar12;
  int *piVar13;
  undefined1 (*pauVar14) [32];
  undefined1 (*pauVar15) [16];
  ulong uVar16;
  int iVar17;
  undefined4 uVar18;
  uint uVar19;
  ulong uVar20;
  Mat *pMVar21;
  int iVar22;
  ulong uVar23;
  long lVar24;
  uint uVar25;
  undefined1 (*pauVar26) [32];
  undefined1 (*pauVar27) [32];
  int iVar28;
  int iVar29;
  long lVar30;
  long lVar31;
  Layer *pLVar32;
  size_t sVar33;
  Option *pOVar34;
  int iVar35;
  ulong uVar36;
  undefined1 (*pauVar37) [32];
  long lVar38;
  undefined1 (*pauVar39) [16];
  bool bVar40;
  long lVar41;
  long lVar42;
  int iVar43;
  uint uVar44;
  int iVar45;
  undefined1 (*pauVar46) [32];
  uint uVar47;
  int iVar48;
  undefined4 *puVar49;
  float sum1 [4];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [64];
  float sum0 [4];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [64];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [64];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [64];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [64];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [64];
  undefined1 auVar104 [32];
  undefined1 auVar105 [64];
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [64];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [64];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [64];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [64];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  ulong uVar165;
  ulong uVar166;
  undefined8 in_stack_fffffffffffffd98;
  Mat local_228;
  undefined1 (*local_1d8) [16];
  Mat *local_1d0;
  ulong local_1c8;
  uint local_1bc;
  ulong local_1b8;
  ulong local_1b0;
  int local_1a4;
  int TILE_N;
  int TILE_M;
  ulong local_198;
  long local_190;
  Mat local_188;
  ulong local_138;
  long local_130;
  long local_128;
  uint local_120;
  int TILE_K;
  Mat local_118;
  Option *local_d0;
  Option *local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  undefined1 (*local_98) [32];
  size_t local_90;
  ulong local_88;
  long local_80;
  long local_78;
  ulong local_70;
  long local_68;
  int local_60;
  uint local_5c;
  long local_58;
  ulong local_50;
  long local_48;
  long local_40;
  ulong local_38;
  
  auVar50 = in_ZMM2._0_16_;
  if ((opt->use_int8_inference == true) && ((this->super_Convolution).int8_scale_term != 0)) {
    iVar7 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar7;
  }
  iVar7 = (this->super_Convolution).kernel_w;
  iVar43 = (this->super_Convolution).kernel_h;
  if (iVar43 != 1 || (iVar7 != 1 || bottom_blob->dims != 1)) {
    pOVar11 = (Option *)CONCAT44((int)((ulong)in_stack_fffffffffffffd98 >> 0x20),bottom_blob->c);
    iVar45 = (this->super_Convolution).dilation_w;
    uVar36 = bottom_blob->elemsize;
    iVar35 = (this->super_Convolution).dilation_h;
    iVar29 = bottom_blob->elempack;
    local_228.cstep = 0;
    local_228.data = (void *)0x0;
    local_228.refcount._0_4_ = 0;
    local_228.refcount._4_4_ = 0;
    local_228.elemsize = 0;
    local_228.elempack = 0;
    local_228.allocator = (Allocator *)0x0;
    local_228.dims = 0;
    local_228.w = 0;
    local_228.h = 0;
    local_228.d = 0;
    local_228.c = 0;
    Convolution::make_padding(&this->super_Convolution,bottom_blob,&local_228,opt);
    iVar22 = local_228.h;
    iVar48 = local_228.w;
    if ((local_228.data == (void *)0x0) || ((long)local_228.c * local_228.cstep == 0)) {
      iVar7 = -100;
    }
    else {
      iVar45 = (~((iVar7 + -1) * iVar45) + local_228.w) / (this->super_Convolution).stride_w + 1;
      iVar43 = (~((iVar43 + -1) * iVar35) + local_228.h) / (this->super_Convolution).stride_h + 1;
      auVar66._4_4_ = (this->super_Convolution).num_output;
      lVar31 = 1;
      if (opt->use_packing_layout == true) {
        lVar31 = 8;
        if ((auVar66._4_4_ & 7) != 0) {
          lVar31 = (ulong)((auVar66._4_4_ & 3) == 0) * 3 + 1;
        }
      }
      iVar35 = (int)lVar31;
      sVar33 = lVar31 * (uVar36 / (ulong)(long)iVar29);
      Mat::create(top_blob,iVar45,iVar43,(int)auVar66._4_4_ / iVar35,sVar33,iVar35,
                  opt->blob_allocator);
      uVar18 = (undefined4)(sVar33 >> 0x20);
      iVar7 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        if (((opt->use_packing_layout == false) &&
            ((((((this->super_Convolution).kernel_w == (this->super_Convolution).kernel_h &&
                (iVar7 = (this->super_Convolution).dilation_w, iVar7 != 1)) &&
               (iVar28 = (this->super_Convolution).dilation_h, iVar28 == iVar7)) &&
              (((this->super_Convolution).stride_w == 1 && ((this->super_Convolution).stride_h == 1)
               ))) && (iVar7 <= iVar45)))) && (iVar28 <= iVar43)) {
          iVar7 = forwardDilation_x86(this,&local_228,top_blob,opt);
        }
        else {
          iVar7 = (int)pOVar11 * iVar29;
          bVar6 = opt->use_winograd23_convolution;
          if (((bVar6 == false) && (opt->use_winograd43_convolution == false)) &&
             (opt->use_winograd63_convolution != true)) {
            bVar4 = false;
          }
          else {
            bVar4 = true;
            if (iVar7 < 9) {
              bVar4 = 8 < (this->super_Convolution).num_output;
            }
          }
          auVar58._0_4_ = (this->super_Convolution).kernel_w;
          auVar58._4_4_ = (this->super_Convolution).kernel_h;
          auVar58._8_4_ = (this->super_Convolution).dilation_w;
          auVar58._12_4_ = (this->super_Convolution).dilation_h;
          local_1d0 = top_blob;
          if ((((auVar58 == _DAT_005a64c0) && ((this->super_Convolution).stride_w == 1)) &&
              ((this->super_Convolution).stride_h == 1)) &&
             ((opt->use_winograd_convolution != false && (bVar4)))) {
            iVar43 = (this->super_Convolution).num_output;
            bVar4 = test_prefer_winograd63(iVar7,iVar43,iVar48,iVar22);
            bVar5 = test_prefer_winograd23(iVar7,iVar43,iVar48,iVar22);
            if ((bVar5) &&
               (((bVar6 == false || ((this->weight_winograd23_data).data == (void *)0x0)) ||
                ((long)(this->weight_winograd23_data).c * (this->weight_winograd23_data).cstep == 0)
                ))) {
              bVar6 = true;
              bVar5 = false;
              bVar3 = false;
              if (bVar4) {
LAB_001cf158:
                bVar3 = false;
                if (((opt->use_winograd63_convolution != true) ||
                    ((this->weight_winograd63_data).data == (void *)0x0)) ||
                   (bVar4 = (long)(this->weight_winograd63_data).c *
                            (this->weight_winograd63_data).cstep == 0, bVar3 = !bVar4,
                   bVar6 || bVar4)) goto LAB_001cf19e;
LAB_001cf207:
                bVar40 = true;
              }
              else {
LAB_001cf19e:
                bVar40 = bVar3;
                if (((opt->use_winograd43_convolution == true) &&
                    ((this->weight_winograd43_data).data != (void *)0x0)) &&
                   (bVar6 = true,
                   (long)(this->weight_winograd43_data).c * (this->weight_winograd43_data).cstep !=
                   0)) goto LAB_001cf211;
                if (((opt->use_winograd63_convolution == true) &&
                    ((this->weight_winograd63_data).data != (void *)0x0)) &&
                   ((long)(this->weight_winograd63_data).c * (this->weight_winograd63_data).cstep !=
                    0)) goto LAB_001cf207;
                bVar5 = true;
              }
              bVar6 = false;
            }
            else {
              if (bVar4) {
                bVar6 = !bVar5 && !bVar4;
                goto LAB_001cf158;
              }
              bVar40 = false;
              bVar6 = false;
              bVar3 = false;
              if (!bVar5 && !bVar4) goto LAB_001cf19e;
            }
LAB_001cf211:
            iVar7 = this->nT;
            iVar43 = iVar7;
            if (iVar7 == 0) {
              iVar43 = opt->num_threads;
            }
            if (opt->num_threads != iVar7 && iVar7 != 0) {
              forward();
            }
            pMVar21 = local_1d0;
            if (bVar5 == false) {
              if (bVar6) {
                iVar7 = conv3x3s1_winograd43
                                  (&local_228,local_1d0,&this->weight_winograd43_data,
                                   &(this->super_Convolution).bias_data,iVar43,opt);
                goto LAB_001d1637;
              }
              if (bVar40) {
                iVar7 = conv3x3s1_winograd63
                                  (&local_228,local_1d0,&this->weight_winograd63_data,
                                   &(this->super_Convolution).bias_data,iVar43,opt);
                goto LAB_001d1637;
              }
            }
            else {
              iVar7 = conv3x3s1_winograd23
                                (&local_228,local_1d0,&this->weight_winograd23_data,
                                 &(this->super_Convolution).bias_data,iVar43,opt);
LAB_001d1637:
              if (iVar7 != 0) goto LAB_001cdd69;
            }
            pLVar32 = this->activation;
            iVar7 = 0;
            if (pLVar32 != (Layer *)0x0) {
              (*pLVar32->_vptr_Layer[9])(pLVar32,pMVar21,opt);
            }
          }
          else {
            iVar45 = get_cpu_level2_cache_size();
            pMVar21 = local_1d0;
            iVar43 = (this->super_Convolution).num_output;
            auVar66._0_4_ = (this->super_Convolution).kernel_w;
            auVar66._4_4_ = (this->super_Convolution).kernel_h;
            auVar66._8_4_ = (this->super_Convolution).dilation_w;
            auVar66._12_4_ = (this->super_Convolution).dilation_h;
            uVar9 = (this->super_Convolution).stride_w;
            uVar44 = (this->super_Convolution).stride_h;
            pOVar34 = (Option *)CONCAT44(uVar18,auVar66._0_4_);
            uVar36 = (ulong)(uint)auVar66._8_4_;
            if ((opt->use_sgemm_convolution != true) ||
               ((int)(auVar66._0_4_ * auVar66._4_4_ * auVar66._12_4_ * uVar44 *
                      iVar7 * iVar43 * auVar66._8_4_ * uVar9 * 8) <= iVar45 &&
                (iVar7 < 0x11 && iVar43 < 0x11))) {
              auVar57._8_4_ = 1;
              auVar57._0_8_ = 0x100000001;
              auVar57._12_4_ = 1;
              auVar58 = vpcmpeqd_avx(auVar66,auVar57);
              auVar58 = vpmovsxdq_avx(auVar58);
              auVar50 = vpcmpeqd_avx(auVar50,auVar50);
              if (((auVar50 & ~auVar58) >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                  SUB161(auVar50 & ~auVar58,0xf) < '\0') {
                if ((iVar29 == 8) && (iVar35 == 8)) {
                  if ((uVar44 == 1 && uVar9 == 1) && auVar66 == _DAT_005a64c0) {
                    conv3x3s1_pack8_avx(&local_228,local_1d0,&this->weight_data_tm,
                                        (Mat *)(this->super_Convolution).bias_data.data,pOVar34);
                    goto LAB_001d1d1b;
                  }
                  auVar50 = vpcmpeqd_avx(auVar66,_DAT_005a64c0);
                  uVar18 = vmovmskps_avx(auVar50);
                  bVar6 = false;
                  iVar7 = 0;
                  if (((((auVar66._4_4_ == 2 && auVar66._0_4_ == 2) && uVar9 == 1) && uVar44 == 1) &
                      (byte)uVar18 >> 2 & (byte)uVar18 >> 3) != 1) goto LAB_001d1c21;
                  local_1b8 = uVar36;
                  conv2x2s1_pack8_avx(&local_228,local_1d0,&this->weight_data_tm,
                                      (Mat *)(this->super_Convolution).bias_data.data,pOVar34);
                  pLVar32 = this->activation;
                  if (pLVar32 == (Layer *)0x0) goto LAB_001cdd69;
LAB_001d1d27:
                  (*pLVar32->_vptr_Layer[9])(pLVar32,pMVar21,opt);
                }
                else {
                  bVar6 = iVar29 == 1;
                  if ((bVar6) && (iVar35 == 8)) {
                    auVar50 = vpcmpeqd_avx(auVar66,_DAT_005a64c0);
                    uVar19 = vmovmskps_avx(auVar50);
                    if (uVar44 == 1 && (uVar9 == 1 && (uVar19 ^ 0xf) == 0)) {
                      local_1b8 = uVar36;
                      conv3x3s1_pack1to8_avx
                                (&local_228,local_1d0,&this->weight_data_tm,
                                 (Mat *)(this->super_Convolution).bias_data.data,pOVar34);
                    }
                    else {
                      bVar6 = true;
                      if ((uVar44 != 2 || uVar9 != 2) || (char)(uVar19 ^ 0xf) != '\0')
                      goto LAB_001d1c21;
                      local_1b8 = uVar36;
                      conv3x3s2_pack1to8_avx
                                (&local_228,local_1d0,&this->weight_data_tm,
                                 (Mat *)(this->super_Convolution).bias_data.data,pOVar34);
                    }
LAB_001d1d1b:
                    pLVar32 = this->activation;
                    if (pLVar32 != (Layer *)0x0) goto LAB_001d1d27;
                  }
                  else {
LAB_001d1c21:
                    uVar19 = auVar66._8_4_ ^ 1;
                    uVar47 = auVar66._12_4_ ^ 1;
                    if (uVar44 == 1 &&
                        (uVar9 == 1 &&
                        ((uVar19 == 0 && uVar47 == 0) &&
                        (((iVar35 == 1 && iVar29 == 8) && (auVar66._0_4_ ^ 3) == 0) &&
                        (auVar66._4_4_ ^ 3) == 0)))) {
                      local_1b8 = uVar36;
                      conv3x3s1_pack8to1_avx
                                (&local_228,local_1d0,&this->weight_data_tm,
                                 (Mat *)(this->super_Convolution).bias_data.data,pOVar34);
                      goto LAB_001d1d1b;
                    }
                    if (bVar6 && iVar35 == 4) {
                      bVar6 = (auVar66._0_4_ ^ 3) != 0 || (auVar66._4_4_ ^ 3) != 0;
                      if ((uVar9 != 1 || uVar44 != 1) || ((bVar6 || uVar19 != 0) || uVar47 != 0)) {
                        if (((bVar6 || uVar19 != 0) || uVar47 != 0) || (uVar44 != 2 || uVar9 != 2))
                        goto LAB_001d1d37;
                        local_1b8 = uVar36;
                        conv3x3s2_pack1to4_sse
                                  (&local_228,local_1d0,&this->weight_data_tm,
                                   (Mat *)(this->super_Convolution).bias_data.data,pOVar34);
                      }
                      else {
                        local_1b8 = uVar36;
                        conv3x3s1_pack1to4_sse
                                  (&local_228,local_1d0,&this->weight_data_tm,
                                   (Mat *)(this->super_Convolution).bias_data.data,pOVar34);
                      }
                      goto LAB_001d1d1b;
                    }
LAB_001d1d37:
                    local_1b8 = uVar36;
                    convolution_packed(&local_228,local_1d0,&this->weight_data_tm,
                                       &(this->super_Convolution).bias_data,auVar66._0_4_,
                                       auVar66._4_4_,auVar66._8_4_,auVar66._12_4_,uVar9,uVar44,
                                       (this->super_Convolution).activation_type,
                                       &(this->super_Convolution).activation_params,pOVar11);
                  }
                }
                iVar7 = 0;
                goto LAB_001cdd69;
              }
            }
            uVar19 = this->nT;
            uVar47 = uVar19;
            if (uVar19 == 0) {
              uVar47 = opt->num_threads;
            }
            if (opt->num_threads != uVar19 && uVar19 != 0) {
              fprintf(_stderr,
                      "opt.num_threads %d changed, convolution gemm will use load-time value %d");
              fputc(10,_stderr);
              pOVar34 = (Option *)(ulong)(uint)(this->super_Convolution).kernel_w;
              auVar66._4_4_ = (this->super_Convolution).kernel_h;
              uVar36 = (ulong)(uint)(this->super_Convolution).dilation_w;
              auVar66._12_4_ = (this->super_Convolution).dilation_h;
              uVar9 = (this->super_Convolution).stride_w;
              uVar44 = (this->super_Convolution).stride_h;
            }
            local_b8 = (ulong)uVar44;
            local_c0 = (ulong)auVar66._12_4_;
            local_b0 = (ulong)uVar9;
            local_d0 = (Option *)(ulong)auVar66._4_4_;
            uVar44 = pMVar21->elempack * pMVar21->c;
            uVar16 = (ulong)uVar44;
            auVar66._12_4_ = pMVar21->h * pMVar21->w;
            uVar23 = (ulong)auVar66._12_4_;
            auVar66._4_4_ = auVar66._4_4_ * (int)pOVar34 * local_228.c * local_228.elempack;
            uVar20 = (ulong)auVar66._4_4_;
            local_1b8 = uVar36;
            local_138 = (ulong)uVar47;
            local_c8 = pOVar34;
            convolution_im2col_gemm_get_optimal_tile_mnk
                      (uVar44,auVar66._12_4_,auVar66._4_4_,&TILE_M,&TILE_N,&TILE_K,uVar47);
            uVar9 = TILE_N;
            local_70 = (ulong)(uint)TILE_M;
            local_120 = (int)(TILE_M + uVar44 + -1) / TILE_M;
            iVar43 = (int)(auVar66._12_4_ + TILE_N + -1) / TILE_N;
            local_1b0 = (ulong)(uint)TILE_K;
            iVar7 = ((int)uVar20 + TILE_K + -1) / TILE_K;
            local_188.cstep = 0;
            local_188.data = (void *)0x0;
            local_188.refcount._0_4_ = 0;
            local_188.refcount._4_4_ = 0;
            local_188.elemsize = 0;
            local_188.elempack = 0;
            local_188.allocator = (Allocator *)0x0;
            local_188.dims = 0;
            local_188.w = 0;
            local_188.h = 0;
            local_188.d = 0;
            local_188.c = 0;
            local_1c8 = CONCAT44(local_1c8._4_4_,iVar7);
            Mat::create(&local_188,TILE_K * TILE_N,iVar7,iVar43,4,opt->workspace_allocator);
            iVar7 = -100;
            local_a0 = uVar23;
            if ((local_188.data != (void *)0x0) && ((long)local_188.c * local_188.cstep != 0)) {
              iVar43 = iVar43 * (int)local_1c8;
              local_1d8 = (undefined1 (*) [16])CONCAT44(local_1d8._4_4_,iVar43);
              local_198 = uVar16;
              if (0 < iVar43) {
                iVar7 = (int)local_c8;
                iVar43 = (int)local_d0;
                bVar5 = iVar43 == 1 && iVar7 == 1;
                bVar6 = (int)local_c0 == 1 && (int)local_1b8 == 1;
                bVar40 = (int)local_b8 == 1 && (int)local_b0 == 1;
                local_190 = CONCAT71(local_190._1_7_,(bVar5 && bVar6) && bVar40);
                bVar4 = (int)local_b8 == 2 && (int)local_b0 == 2;
                local_128 = CONCAT71(local_128._1_7_,bVar5 && bVar4);
                bVar5 = (iVar43 == 3 && iVar7 == 3) && bVar6;
                local_130 = CONCAT71(local_130._1_7_,bVar5 && bVar40);
                local_68 = CONCAT71(local_68._1_7_,bVar5 && bVar4);
                bVar5 = (iVar43 == 5 && iVar7 == 5) && bVar6;
                local_78 = CONCAT71(local_78._1_7_,bVar40 && bVar5);
                local_80 = CONCAT71(local_80._1_7_,bVar5 && bVar4);
                local_88 = CONCAT71(local_88._1_7_,((iVar43 == 7 && iVar7 == 7) && bVar6) && bVar4);
                iVar7 = 0;
                do {
                  iVar43 = (iVar7 / (int)local_1c8) * uVar9;
                  iVar45 = (int)((long)iVar7 % (long)(int)local_1c8) * (int)local_1b0;
                  uVar44 = (int)local_a0 - iVar43;
                  if ((int)uVar9 < (int)uVar44) {
                    uVar44 = uVar9;
                  }
                  auVar66._4_4_ = (int)uVar20 - iVar45;
                  uVar36 = (ulong)auVar66._4_4_;
                  if ((int)local_1b0 < (int)auVar66._4_4_) {
                    uVar36 = local_1b0 & 0xffffffff;
                  }
                  pMVar21 = (Mat *)((long)local_188.data +
                                   ((long)iVar7 % (long)(int)local_1c8 & 0xffffffffU) *
                                   (long)local_188.w * local_188.elemsize +
                                   (long)(iVar7 / (int)local_1c8) * local_188.cstep *
                                   local_188.elemsize);
                  iVar35 = (int)uVar36;
                  if ((char)local_190 == '\0') {
                    if ((char)local_128 == '\0') {
                      if ((char)local_130 != '\0') {
                        uVar23 = 1;
                        uVar36 = 1;
LAB_001cf067:
                        pOVar11 = (Option *)0x3;
                        goto LAB_001cf06e;
                      }
                      if ((char)local_68 != '\0') {
                        uVar23 = 2;
                        uVar36 = 2;
                        goto LAB_001cf067;
                      }
                      if ((char)local_78 != '\0') {
                        uVar23 = 1;
                        uVar36 = 1;
LAB_001cf0dc:
                        pOVar11 = (Option *)0x5;
                        goto LAB_001cf06e;
                      }
                      if ((char)local_80 != '\0') {
                        uVar23 = 2;
                        uVar36 = 2;
                        goto LAB_001cf0dc;
                      }
                      pOVar11 = local_c8;
                      pOVar34 = local_d0;
                      uVar165 = local_1b8;
                      uVar166 = local_c0;
                      uVar36 = local_b0;
                      uVar23 = local_b8;
                      if ((char)local_88 != '\0') {
                        uVar23 = 2;
                        uVar36 = 2;
                        pOVar11 = (Option *)0x7;
                        goto LAB_001cf06e;
                      }
                    }
                    else {
                      uVar23 = 2;
                      uVar36 = 2;
                      pOVar11 = (Option *)0x1;
LAB_001cf06e:
                      pOVar34 = pOVar11;
                      uVar165 = 1;
                      uVar166 = 1;
                    }
                    convolution_im2col_input_tile_impl
                              (&local_228,pMVar21,iVar43,uVar44,iVar45,iVar35,(int)pOVar11,
                               (int)pOVar34,(int)uVar165,(int)uVar166,(int)uVar36,(int)uVar23);
                  }
                  else {
                    lVar31 = 0;
                    lVar24 = (long)iVar45;
                    lVar10 = (long)iVar43;
                    if (0xb < (int)uVar44) {
                      iVar43 = iVar35 + 3;
                      if (-1 < iVar35) {
                        iVar43 = iVar35;
                      }
                      iVar29 = iVar35 + 7;
                      if (-1 < iVar35) {
                        iVar29 = iVar35;
                      }
                      iVar22 = iVar45 + 3;
                      iVar48 = iVar45 + 7;
                      if (-1 < iVar45) {
                        iVar22 = iVar45;
                        iVar48 = iVar45;
                      }
                      lVar38 = 0;
                      do {
                        if (local_228.elempack == 8) {
                          if (7 < iVar35) {
                            pauVar14 = (undefined1 (*) [32])
                                       ((long)local_228.data +
                                       (lVar38 + lVar10) * 0x20 +
                                       local_228.cstep * (long)(iVar48 >> 3) * local_228.elemsize);
                            iVar28 = iVar29 >> 3;
                            do {
                              auVar82 = vunpcklps_avx(*pauVar14,pauVar14[1]);
                              auVar150 = vunpckhps_avx(*pauVar14,pauVar14[1]);
                              auVar140 = vunpcklps_avx(pauVar14[2],pauVar14[3]);
                              auVar151 = vunpckhps_avx(pauVar14[2],pauVar14[3]);
                              auVar129 = vunpcklps_avx(pauVar14[4],pauVar14[5]);
                              auVar152 = vunpckhps_avx(pauVar14[4],pauVar14[5]);
                              auVar92 = vunpcklps_avx(pauVar14[6],pauVar14[7]);
                              auVar153 = vunpckhps_avx(pauVar14[6],pauVar14[7]);
                              auVar155 = vunpcklps_avx(pauVar14[8],pauVar14[9]);
                              auVar154 = vunpckhps_avx(pauVar14[8],pauVar14[9]);
                              auVar156 = vunpcklps_avx(pauVar14[10],pauVar14[0xb]);
                              auVar160 = vunpckhps_avx(pauVar14[10],pauVar14[0xb]);
                              auVar81 = vunpcklpd_avx(auVar82,auVar140);
                              auVar82 = vunpckhpd_avx(auVar82,auVar140);
                              auVar140 = vunpcklpd_avx(auVar150,auVar151);
                              auVar150 = vunpckhpd_avx(auVar150,auVar151);
                              auVar100 = vunpcklpd_avx(auVar129,auVar92);
                              auVar151 = vunpckhpd_avx(auVar129,auVar92);
                              auVar129 = vunpcklpd_avx(auVar152,auVar153);
                              auVar152 = vunpckhpd_avx(auVar152,auVar153);
                              auVar92 = vunpcklpd_avx(auVar155,auVar156);
                              auVar153 = vunpckhpd_avx(auVar155,auVar156);
                              auVar155 = vunpcklpd_avx(auVar154,auVar160);
                              auVar154 = vunpckhpd_avx(auVar154,auVar160);
                              auVar58 = auVar100._0_16_;
                              auVar160 = vperm2f128_avx(auVar81,auVar100,0x31);
                              auVar84 = auVar92._0_16_;
                              auVar50 = auVar82._0_16_;
                              auVar82 = vperm2f128_avx(auVar92,auVar82,0x31);
                              auVar100._16_16_ = auVar153._0_16_;
                              auVar100._0_16_ = auVar151._0_16_;
                              auVar151 = vperm2f128_avx(auVar151,auVar153,0x31);
                              auVar139 = auVar140._0_16_;
                              auVar57 = auVar129._0_16_;
                              auVar153 = vperm2f128_avx(auVar140,auVar129,0x31);
                              auVar140._16_16_ = auVar150._0_16_;
                              auVar140._0_16_ = auVar155._0_16_;
                              auVar150 = vperm2f128_avx(auVar155,auVar150,0x31);
                              auVar66 = auVar152._0_16_;
                              auVar106 = auVar154._0_16_;
                              auVar152 = vperm2f128_avx(auVar152,auVar154,0x31);
                              pMVar21->data = (void *)SUB168(auVar81._0_16_,0);
                              pMVar21->refcount = (int *)SUB168(auVar81._0_16_,8);
                              pMVar21->elemsize = auVar58._0_8_;
                              pMVar21->elempack = auVar58._8_4_;
                              *(int *)&pMVar21->field_0x1c = auVar58._12_4_;
                              pMVar21->allocator = (Allocator *)auVar84._0_8_;
                              pMVar21->dims = auVar84._8_4_;
                              pMVar21->w = auVar84._12_4_;
                              pMVar21->h = auVar50._0_4_;
                              pMVar21->d = auVar50._4_4_;
                              pMVar21->c = auVar50._8_4_;
                              *(int *)&pMVar21->field_0x3c = auVar50._12_4_;
                              *(undefined1 (*) [32])&pMVar21->cstep = auVar100;
                              pMVar21[1].elempack = auVar139._0_4_;
                              *(int *)&pMVar21[1].field_0x1c = auVar139._4_4_;
                              pMVar21[1].allocator = (Allocator *)auVar139._8_8_;
                              pMVar21[1].dims = auVar57._0_4_;
                              pMVar21[1].w = auVar57._4_4_;
                              pMVar21[1].h = auVar57._8_4_;
                              pMVar21[1].d = auVar57._12_4_;
                              *(undefined1 (*) [32])&pMVar21[1].c = auVar140;
                              pMVar21[2].elemsize = auVar66._0_8_;
                              pMVar21[2].elempack = auVar66._8_4_;
                              *(int *)&pMVar21[2].field_0x1c = auVar66._12_4_;
                              pMVar21[2].allocator = (Allocator *)auVar106._0_8_;
                              pMVar21[2].dims = auVar106._8_4_;
                              pMVar21[2].w = auVar106._12_4_;
                              *(undefined1 (*) [32])&pMVar21[2].h = auVar160;
                              pMVar21[3].refcount = (int *)auVar82._0_8_;
                              pMVar21[3].elemsize = auVar82._8_8_;
                              pMVar21[3].elempack = auVar82._16_4_;
                              *(int *)&pMVar21[3].field_0x1c = auVar82._20_4_;
                              pMVar21[3].allocator = (Allocator *)auVar82._24_8_;
                              pMVar21[3].dims = auVar151._0_4_;
                              pMVar21[3].w = auVar151._4_4_;
                              pMVar21[3].h = auVar151._8_4_;
                              pMVar21[3].d = auVar151._12_4_;
                              pMVar21[3].c = auVar151._16_4_;
                              *(int *)&pMVar21[3].field_0x3c = auVar151._20_4_;
                              pMVar21[3].cstep = auVar151._24_8_;
                              pMVar21[4].data = (void *)auVar153._0_8_;
                              pMVar21[4].refcount = (int *)auVar153._8_8_;
                              pMVar21[4].elemsize = auVar153._16_8_;
                              pMVar21[4].elempack = auVar153._24_4_;
                              *(int *)&pMVar21[4].field_0x1c = auVar153._28_4_;
                              pMVar21[4].allocator = (Allocator *)auVar150._0_8_;
                              pMVar21[4].dims = auVar150._8_4_;
                              pMVar21[4].w = auVar150._12_4_;
                              pMVar21[4].h = auVar150._16_4_;
                              pMVar21[4].d = auVar150._20_4_;
                              pMVar21[4].c = auVar150._24_4_;
                              *(int *)&pMVar21[4].field_0x3c = auVar150._28_4_;
                              *(undefined1 (*) [32])&pMVar21[4].cstep = auVar152;
                              pMVar21 = (Mat *)&pMVar21[5].elempack;
                              pauVar14 = pauVar14 + local_228.cstep;
                              iVar28 = iVar28 + -1;
                            } while (iVar28 != 0);
                            goto LAB_001ce60f;
                          }
                        }
                        else {
LAB_001ce60f:
                          if (local_228.elempack == 4) {
                            if (iVar35 < 4) goto LAB_001ce7ae;
                            pauVar15 = (undefined1 (*) [16])
                                       ((long)local_228.data +
                                       (lVar38 + lVar10) * 0x10 +
                                       local_228.cstep * (long)(iVar22 >> 2) * local_228.elemsize);
                            iVar28 = iVar43 >> 2;
                            do {
                              auVar66 = vpunpckldq_avx(*pauVar15,pauVar15[1]);
                              auVar57 = vpunpckldq_avx(pauVar15[2],pauVar15[3]);
                              auVar50 = vpunpckhdq_avx(*pauVar15,pauVar15[1]);
                              auVar58 = vpunpckhdq_avx(pauVar15[2],pauVar15[3]);
                              auVar84 = vpunpcklqdq_avx(auVar66,auVar57);
                              auVar66 = vpunpckhqdq_avx(auVar66,auVar57);
                              auVar57 = vpunpcklqdq_avx(auVar50,auVar58);
                              auVar50 = vpunpckhqdq_avx(auVar50,auVar58);
                              auVar58 = vunpcklps_avx(pauVar15[4],pauVar15[5]);
                              auVar142 = vunpcklps_avx(pauVar15[6],pauVar15[7]);
                              auVar106 = vunpckhps_avx(pauVar15[4],pauVar15[5]);
                              auVar139 = vunpckhps_avx(pauVar15[6],pauVar15[7]);
                              auVar144 = vunpcklpd_avx(auVar58,auVar142);
                              auVar58 = vunpckhpd_avx(auVar58,auVar142);
                              auVar145 = vunpcklpd_avx(auVar106,auVar139);
                              auVar106 = vunpckhpd_avx(auVar106,auVar139);
                              auVar139 = vunpcklps_avx(pauVar15[8],pauVar15[9]);
                              auVar146 = vunpcklps_avx(pauVar15[10],pauVar15[0xb]);
                              auVar142 = vunpckhps_avx(pauVar15[8],pauVar15[9]);
                              auVar143 = vunpckhps_avx(pauVar15[10],pauVar15[0xb]);
                              auVar109 = vunpcklpd_avx(auVar139,auVar146);
                              auVar139 = vunpckhpd_avx(auVar139,auVar146);
                              auVar146 = vunpcklpd_avx(auVar142,auVar143);
                              auVar142 = vunpckhpd_avx(auVar142,auVar143);
                              pMVar21->data = (void *)auVar84._0_8_;
                              pMVar21->refcount = (int *)auVar84._8_8_;
                              pMVar21->elemsize = auVar144._0_8_;
                              pMVar21->elempack = auVar144._8_4_;
                              *(int *)&pMVar21->field_0x1c = auVar144._12_4_;
                              pMVar21->allocator = (Allocator *)auVar109._0_8_;
                              pMVar21->dims = auVar109._8_4_;
                              pMVar21->w = auVar109._12_4_;
                              pMVar21->h = auVar66._0_4_;
                              pMVar21->d = auVar66._4_4_;
                              pMVar21->c = auVar66._8_4_;
                              *(int *)&pMVar21->field_0x3c = auVar66._12_4_;
                              *(undefined1 (*) [16])&pMVar21->cstep = auVar58;
                              pMVar21[1].refcount = (int *)auVar139._0_8_;
                              pMVar21[1].elemsize = auVar139._8_8_;
                              pMVar21[1].elempack = auVar57._0_4_;
                              *(int *)&pMVar21[1].field_0x1c = auVar57._4_4_;
                              pMVar21[1].allocator = (Allocator *)auVar57._8_8_;
                              pMVar21[1].dims = auVar145._0_4_;
                              pMVar21[1].w = auVar145._4_4_;
                              pMVar21[1].h = auVar145._8_4_;
                              pMVar21[1].d = auVar145._12_4_;
                              pMVar21[1].c = auVar146._0_4_;
                              *(int *)&pMVar21[1].field_0x3c = auVar146._4_4_;
                              pMVar21[1].cstep = auVar146._8_8_;
                              pMVar21[2].data = (void *)auVar50._0_8_;
                              pMVar21[2].refcount = (int *)auVar50._8_8_;
                              pMVar21[2].elemsize = auVar106._0_8_;
                              pMVar21[2].elempack = auVar106._8_4_;
                              *(int *)&pMVar21[2].field_0x1c = auVar106._12_4_;
                              pMVar21[2].allocator = (Allocator *)auVar142._0_8_;
                              pMVar21[2].dims = auVar142._8_4_;
                              pMVar21[2].w = auVar142._12_4_;
                              pMVar21 = (Mat *)&pMVar21[2].h;
                              pauVar15 = pauVar15 + local_228.cstep;
                              iVar28 = iVar28 + -1;
                            } while (iVar28 != 0);
                          }
                          if (local_228.elempack == 1 && 0 < iVar35) {
                            pauVar14 = (undefined1 (*) [32])
                                       ((long)local_228.data +
                                       lVar10 * 4 +
                                       lVar38 * 4 + local_228.cstep * lVar24 * local_228.elemsize);
                            uVar16 = uVar36;
                            do {
                              uVar1 = *(undefined8 *)((long)(pauVar14 + 1) + 0);
                              uVar18 = *(undefined4 *)((long)(pauVar14 + 1) + 8);
                              uVar2 = *(undefined4 *)((long)(pauVar14 + 1) + 0xc);
                              *(undefined1 (*) [32])pMVar21 = *pauVar14;
                              pMVar21->allocator = (Allocator *)uVar1;
                              pMVar21->dims = uVar18;
                              pMVar21->w = uVar2;
                              pMVar21 = (Mat *)&pMVar21->h;
                              pauVar14 = (undefined1 (*) [32])(*pauVar14 + local_228.cstep * 4);
                              auVar66._4_4_ = (int)uVar16 - 1;
                              uVar16 = (ulong)auVar66._4_4_;
                            } while (auVar66._4_4_ != 0);
                          }
                        }
LAB_001ce7ae:
                        lVar31 = lVar38 + 0xc;
                        uVar23 = lVar38 + 0x17;
                        uVar16 = local_198;
                        lVar38 = lVar31;
                      } while (uVar23 < uVar44);
                    }
                    lVar38 = (long)(int)uVar44;
                    if ((int)lVar31 + 7 < (int)uVar44) {
                      iVar43 = iVar35 + 3;
                      if (-1 < iVar35) {
                        iVar43 = iVar35;
                      }
                      iVar29 = iVar35 + 7;
                      if (-1 < iVar35) {
                        iVar29 = iVar35;
                      }
                      iVar22 = iVar45 + 3;
                      iVar48 = iVar45 + 7;
                      if (-1 < iVar45) {
                        iVar22 = iVar45;
                        iVar48 = iVar45;
                      }
                      lVar42 = (long)(int)lVar31;
                      do {
                        if (local_228.elempack == 8) {
                          if (7 < iVar35) {
                            pauVar14 = (undefined1 (*) [32])
                                       ((long)local_228.data +
                                       (lVar42 + lVar10) * 0x20 +
                                       local_228.cstep * (long)(iVar48 >> 3) * local_228.elemsize);
                            iVar28 = iVar29 >> 3;
                            do {
                              auVar82 = vunpcklps_avx(*pauVar14,pauVar14[1]);
                              auVar150 = vunpckhps_avx(*pauVar14,pauVar14[1]);
                              auVar160 = vunpcklps_avx(pauVar14[2],pauVar14[3]);
                              auVar151 = vunpckhps_avx(pauVar14[2],pauVar14[3]);
                              auVar140 = vunpcklps_avx(pauVar14[4],pauVar14[5]);
                              auVar152 = vunpckhps_avx(pauVar14[4],pauVar14[5]);
                              auVar100 = vunpcklps_avx(pauVar14[6],pauVar14[7]);
                              auVar153 = vunpckhps_avx(pauVar14[6],pauVar14[7]);
                              auVar154 = vunpcklpd_avx(auVar82,auVar160);
                              auVar82 = vunpckhpd_avx(auVar82,auVar160);
                              auVar160 = vunpcklpd_avx(auVar150,auVar151);
                              auVar150 = vunpckhpd_avx(auVar150,auVar151);
                              auVar81 = vunpcklpd_avx(auVar140,auVar100);
                              auVar151 = vunpckhpd_avx(auVar140,auVar100);
                              auVar140 = vunpcklpd_avx(auVar152,auVar153);
                              auVar152 = vunpckhpd_avx(auVar152,auVar153);
                              auVar66 = auVar81._0_16_;
                              auVar58 = auVar82._0_16_;
                              auVar57 = auVar151._0_16_;
                              auVar129._16_16_ = auVar140._0_16_;
                              auVar129._0_16_ = auVar160._0_16_;
                              auVar50 = auVar150._0_16_;
                              auVar84 = auVar152._0_16_;
                              auVar153 = vperm2f128_avx(auVar154,auVar81,0x31);
                              auVar82 = vperm2f128_avx(auVar82,auVar151,0x31);
                              auVar151 = vperm2f128_avx(auVar160,auVar140,0x31);
                              auVar150 = vperm2f128_avx(auVar150,auVar152,0x31);
                              pMVar21->data = (void *)SUB168(auVar154._0_16_,0);
                              pMVar21->refcount = (int *)SUB168(auVar154._0_16_,8);
                              pMVar21->elemsize = auVar66._0_8_;
                              pMVar21->elempack = auVar66._8_4_;
                              *(int *)&pMVar21->field_0x1c = auVar66._12_4_;
                              pMVar21->allocator = (Allocator *)auVar58._0_8_;
                              pMVar21->dims = auVar58._8_4_;
                              pMVar21->w = auVar58._12_4_;
                              pMVar21->h = auVar57._0_4_;
                              pMVar21->d = auVar57._4_4_;
                              pMVar21->c = auVar57._8_4_;
                              *(int *)&pMVar21->field_0x3c = auVar57._12_4_;
                              *(undefined1 (*) [32])&pMVar21->cstep = auVar129;
                              pMVar21[1].elempack = auVar50._0_4_;
                              *(int *)&pMVar21[1].field_0x1c = auVar50._4_4_;
                              pMVar21[1].allocator = (Allocator *)auVar50._8_8_;
                              pMVar21[1].dims = auVar84._0_4_;
                              pMVar21[1].w = auVar84._4_4_;
                              pMVar21[1].h = auVar84._8_4_;
                              pMVar21[1].d = auVar84._12_4_;
                              *(undefined1 (*) [32])&pMVar21[1].c = auVar153;
                              pMVar21[2].elemsize = auVar82._0_8_;
                              pMVar21[2].elempack = auVar82._8_4_;
                              *(int *)&pMVar21[2].field_0x1c = auVar82._12_4_;
                              pMVar21[2].allocator = (Allocator *)auVar82._16_8_;
                              pMVar21[2].dims = auVar82._24_4_;
                              pMVar21[2].w = auVar82._28_4_;
                              *(undefined1 (*) [32])&pMVar21[2].h = auVar151;
                              pMVar21[3].refcount = (int *)auVar150._0_8_;
                              pMVar21[3].elemsize = auVar150._8_8_;
                              pMVar21[3].elempack = auVar150._16_4_;
                              *(int *)&pMVar21[3].field_0x1c = auVar150._20_4_;
                              pMVar21[3].allocator = (Allocator *)auVar150._24_8_;
                              pMVar21 = (Mat *)&pMVar21[3].dims;
                              pauVar14 = pauVar14 + local_228.cstep;
                              iVar28 = iVar28 + -1;
                            } while (iVar28 != 0);
                            goto LAB_001ce96f;
                          }
                        }
                        else {
LAB_001ce96f:
                          if (local_228.elempack == 4) {
                            if (iVar35 < 4) goto LAB_001cea9b;
                            pauVar15 = (undefined1 (*) [16])
                                       ((long)local_228.data +
                                       (lVar42 + lVar10) * 0x10 +
                                       local_228.cstep * (long)(iVar22 >> 2) * local_228.elemsize);
                            iVar28 = iVar43 >> 2;
                            do {
                              auVar66 = vpunpckldq_avx(*pauVar15,pauVar15[1]);
                              auVar57 = vpunpckldq_avx(pauVar15[2],pauVar15[3]);
                              auVar50 = vpunpckhdq_avx(*pauVar15,pauVar15[1]);
                              auVar58 = vpunpckhdq_avx(pauVar15[2],pauVar15[3]);
                              auVar84 = vpunpcklqdq_avx(auVar66,auVar57);
                              auVar66 = vpunpckhqdq_avx(auVar66,auVar57);
                              auVar57 = vpunpcklqdq_avx(auVar50,auVar58);
                              auVar50 = vpunpckhqdq_avx(auVar50,auVar58);
                              auVar58 = vunpcklps_avx(pauVar15[4],pauVar15[5]);
                              auVar143 = vunpcklps_avx(pauVar15[6],pauVar15[7]);
                              auVar106 = vunpckhps_avx(pauVar15[4],pauVar15[5]);
                              auVar139 = vunpckhps_avx(pauVar15[6],pauVar15[7]);
                              auVar142 = vunpcklpd_avx(auVar58,auVar143);
                              auVar58 = vunpckhpd_avx(auVar58,auVar143);
                              auVar143 = vunpcklpd_avx(auVar106,auVar139);
                              auVar106 = vunpckhpd_avx(auVar106,auVar139);
                              pMVar21->data = (void *)auVar84._0_8_;
                              pMVar21->refcount = (int *)auVar84._8_8_;
                              pMVar21->elemsize = auVar142._0_8_;
                              pMVar21->elempack = auVar142._8_4_;
                              *(int *)&pMVar21->field_0x1c = auVar142._12_4_;
                              pMVar21->allocator = (Allocator *)auVar66._0_8_;
                              pMVar21->dims = auVar66._8_4_;
                              pMVar21->w = auVar66._12_4_;
                              pMVar21->h = auVar58._0_4_;
                              pMVar21->d = auVar58._4_4_;
                              pMVar21->c = auVar58._8_4_;
                              *(int *)&pMVar21->field_0x3c = auVar58._12_4_;
                              *(undefined1 (*) [16])&pMVar21->cstep = auVar57;
                              pMVar21[1].refcount = (int *)auVar143._0_8_;
                              pMVar21[1].elemsize = auVar143._8_8_;
                              pMVar21[1].elempack = auVar50._0_4_;
                              *(int *)&pMVar21[1].field_0x1c = auVar50._4_4_;
                              pMVar21[1].allocator = (Allocator *)auVar50._8_8_;
                              pMVar21[1].dims = auVar106._0_4_;
                              pMVar21[1].w = auVar106._4_4_;
                              pMVar21[1].h = auVar106._8_4_;
                              pMVar21[1].d = auVar106._12_4_;
                              pMVar21 = (Mat *)&pMVar21[1].c;
                              pauVar15 = pauVar15 + local_228.cstep;
                              iVar28 = iVar28 + -1;
                            } while (iVar28 != 0);
                          }
                          if (local_228.elempack == 1 && 0 < iVar35) {
                            pauVar14 = (undefined1 (*) [32])
                                       ((long)local_228.data +
                                       lVar10 * 4 +
                                       lVar42 * 4 + local_228.cstep * lVar24 * local_228.elemsize);
                            uVar16 = uVar36;
                            do {
                              *(undefined1 (*) [32])pMVar21 = *pauVar14;
                              pMVar21 = (Mat *)&pMVar21->allocator;
                              pauVar14 = (undefined1 (*) [32])(*pauVar14 + local_228.cstep * 4);
                              auVar66._4_4_ = (int)uVar16 - 1;
                              uVar16 = (ulong)auVar66._4_4_;
                            } while (auVar66._4_4_ != 0);
                          }
                        }
LAB_001cea9b:
                        lVar31 = lVar42 + 8;
                        bVar6 = lVar42 < lVar38 + -0xf;
                        uVar16 = local_198;
                        lVar42 = lVar31;
                      } while (bVar6);
                    }
                    if ((int)((uint)lVar31 | 3) < (int)uVar44) {
                      iVar43 = iVar35 + 3;
                      if (-1 < iVar35) {
                        iVar43 = iVar35;
                      }
                      iVar29 = iVar35 + 7;
                      if (-1 < iVar35) {
                        iVar29 = iVar35;
                      }
                      iVar22 = iVar45 + 3;
                      iVar48 = iVar45 + 7;
                      if (-1 < iVar45) {
                        iVar22 = iVar45;
                        iVar48 = iVar45;
                      }
                      lVar42 = (long)(int)(uint)lVar31;
                      do {
                        if (local_228.elempack == 8) {
                          if (7 < iVar35) {
                            pauVar14 = (undefined1 (*) [32])
                                       ((long)local_228.data +
                                       (lVar42 + lVar10) * 0x20 +
                                       local_228.cstep * (long)(iVar48 >> 3) * local_228.elemsize);
                            iVar28 = iVar29 >> 3;
                            do {
                              auVar82 = vunpcklps_avx(*pauVar14,pauVar14[1]);
                              auVar150 = vunpckhps_avx(*pauVar14,pauVar14[1]);
                              auVar153 = vunpcklps_avx(pauVar14[2],pauVar14[3]);
                              auVar151 = vunpckhps_avx(pauVar14[2],pauVar14[3]);
                              auVar152 = vunpcklpd_avx(auVar82,auVar153);
                              auVar82 = vunpckhpd_avx(auVar82,auVar153);
                              auVar153 = vunpcklpd_avx(auVar150,auVar151);
                              auVar150 = vunpckhpd_avx(auVar150,auVar151);
                              auVar58 = auVar82._0_16_;
                              auVar66 = auVar153._0_16_;
                              auVar50 = auVar150._0_16_;
                              auVar82 = vperm2f128_avx(auVar152,auVar82,0x31);
                              auVar150 = vperm2f128_avx(auVar153,auVar150,0x31);
                              pMVar21->data = (void *)SUB168(auVar152._0_16_,0);
                              pMVar21->refcount = (int *)SUB168(auVar152._0_16_,8);
                              pMVar21->elemsize = auVar58._0_8_;
                              pMVar21->elempack = auVar58._8_4_;
                              *(int *)&pMVar21->field_0x1c = auVar58._12_4_;
                              pMVar21->allocator = (Allocator *)auVar66._0_8_;
                              pMVar21->dims = auVar66._8_4_;
                              pMVar21->w = auVar66._12_4_;
                              pMVar21->h = auVar50._0_4_;
                              pMVar21->d = auVar50._4_4_;
                              pMVar21->c = auVar50._8_4_;
                              *(int *)&pMVar21->field_0x3c = auVar50._12_4_;
                              *(undefined1 (*) [32])&pMVar21->cstep = auVar82;
                              pMVar21[1].elempack = auVar150._0_4_;
                              *(int *)&pMVar21[1].field_0x1c = auVar150._4_4_;
                              pMVar21[1].allocator = (Allocator *)auVar150._8_8_;
                              pMVar21[1].dims = auVar150._16_4_;
                              pMVar21[1].w = auVar150._20_4_;
                              pMVar21[1].h = auVar150._24_4_;
                              pMVar21[1].d = auVar150._28_4_;
                              pMVar21 = (Mat *)&pMVar21[1].c;
                              pauVar14 = pauVar14 + local_228.cstep;
                              iVar28 = iVar28 + -1;
                            } while (iVar28 != 0);
                            goto LAB_001cebce;
                          }
                        }
                        else {
LAB_001cebce:
                          if (local_228.elempack == 4) {
                            if (iVar35 < 4) goto LAB_001cecaa;
                            pauVar15 = (undefined1 (*) [16])
                                       ((long)local_228.data +
                                       (lVar42 + lVar10) * 0x10 +
                                       local_228.cstep * (long)(iVar22 >> 2) * local_228.elemsize);
                            iVar28 = iVar43 >> 2;
                            do {
                              auVar66 = vpunpckldq_avx(*pauVar15,pauVar15[1]);
                              auVar57 = vpunpckldq_avx(pauVar15[2],pauVar15[3]);
                              auVar50 = vpunpckhdq_avx(*pauVar15,pauVar15[1]);
                              auVar58 = vpunpckhdq_avx(pauVar15[2],pauVar15[3]);
                              auVar84 = vpunpcklqdq_avx(auVar66,auVar57);
                              auVar66 = vpunpckhqdq_avx(auVar66,auVar57);
                              auVar57 = vpunpcklqdq_avx(auVar50,auVar58);
                              auVar50 = vpunpckhqdq_avx(auVar50,auVar58);
                              pMVar21->data = (void *)auVar84._0_8_;
                              pMVar21->refcount = (int *)auVar84._8_8_;
                              pMVar21->elemsize = auVar66._0_8_;
                              pMVar21->elempack = auVar66._8_4_;
                              *(int *)&pMVar21->field_0x1c = auVar66._12_4_;
                              pMVar21->allocator = (Allocator *)auVar57._0_8_;
                              pMVar21->dims = auVar57._8_4_;
                              pMVar21->w = auVar57._12_4_;
                              pMVar21->h = auVar50._0_4_;
                              pMVar21->d = auVar50._4_4_;
                              pMVar21->c = auVar50._8_4_;
                              *(int *)&pMVar21->field_0x3c = auVar50._12_4_;
                              pMVar21 = (Mat *)&pMVar21->cstep;
                              pauVar15 = pauVar15 + local_228.cstep;
                              iVar28 = iVar28 + -1;
                            } while (iVar28 != 0);
                          }
                          if (local_228.elempack == 1 && 0 < iVar35) {
                            pauVar15 = (undefined1 (*) [16])
                                       ((long)local_228.data +
                                       lVar10 * 4 +
                                       lVar42 * 4 + local_228.cstep * lVar24 * local_228.elemsize);
                            uVar16 = uVar36;
                            do {
                              *(undefined1 (*) [16])pMVar21 = *pauVar15;
                              pMVar21 = (Mat *)&pMVar21->elemsize;
                              pauVar15 = (undefined1 (*) [16])(*pauVar15 + local_228.cstep * 4);
                              auVar66._4_4_ = (int)uVar16 - 1;
                              uVar16 = (ulong)auVar66._4_4_;
                            } while (auVar66._4_4_ != 0);
                          }
                        }
LAB_001cecaa:
                        lVar31 = lVar42 + 4;
                        lVar41 = lVar42 + 7;
                        uVar16 = local_198;
                        lVar42 = lVar31;
                      } while (lVar41 < lVar38);
                    }
                    auVar66._4_4_ = (uint)lVar31;
                    if ((int)(auVar66._4_4_ | 1) < (int)uVar44) {
                      iVar43 = iVar35 + 3;
                      if (-1 < iVar35) {
                        iVar43 = iVar35;
                      }
                      iVar29 = iVar35 + 7;
                      if (-1 < iVar35) {
                        iVar29 = iVar35;
                      }
                      iVar22 = iVar45 + 3;
                      iVar48 = iVar45 + 7;
                      if (-1 < iVar45) {
                        iVar22 = iVar45;
                        iVar48 = iVar45;
                      }
                      lVar42 = lVar10 * 4 + (long)(int)auVar66._4_4_ * 4;
                      lVar41 = (long)(int)auVar66._4_4_;
                      do {
                        if (local_228.elempack == 8) {
                          if (7 < iVar35) {
                            pauVar14 = (undefined1 (*) [32])
                                       ((long)local_228.data +
                                       (lVar41 + lVar10) * 0x20 +
                                       local_228.cstep * (long)(iVar48 >> 3) * local_228.elemsize);
                            iVar28 = iVar29 >> 3;
                            do {
                              auVar150 = vunpcklps_avx(*pauVar14,pauVar14[1]);
                              auVar82 = vunpckhps_avx(*pauVar14,pauVar14[1]);
                              auVar50 = auVar82._0_16_;
                              auVar82 = vperm2f128_avx(auVar150,auVar82,0x31);
                              pMVar21->data = (void *)SUB168(auVar150._0_16_,0);
                              pMVar21->refcount = (int *)SUB168(auVar150._0_16_,8);
                              pMVar21->elemsize = auVar50._0_8_;
                              pMVar21->elempack = auVar50._8_4_;
                              *(int *)&pMVar21->field_0x1c = auVar50._12_4_;
                              pMVar21->allocator = (Allocator *)auVar82._0_8_;
                              pMVar21->dims = auVar82._8_4_;
                              pMVar21->w = auVar82._12_4_;
                              pMVar21->h = auVar82._16_4_;
                              pMVar21->d = auVar82._20_4_;
                              pMVar21->c = auVar82._24_4_;
                              *(int *)&pMVar21->field_0x3c = auVar82._28_4_;
                              pMVar21 = (Mat *)&pMVar21->cstep;
                              pauVar14 = pauVar14 + local_228.cstep;
                              iVar28 = iVar28 + -1;
                            } while (iVar28 != 0);
                            goto LAB_001cedba;
                          }
                        }
                        else {
LAB_001cedba:
                          if (local_228.elempack == 4) {
                            if (iVar35 < 4) goto LAB_001cee6b;
                            pauVar15 = (undefined1 (*) [16])
                                       ((long)local_228.data +
                                       (lVar41 + lVar10) * 0x10 +
                                       local_228.cstep * (long)(iVar22 >> 2) * local_228.elemsize);
                            iVar28 = iVar43 >> 2;
                            do {
                              auVar58 = vpunpckldq_avx(*pauVar15,pauVar15[1]);
                              auVar50 = vpunpckhdq_avx(*pauVar15,pauVar15[1]);
                              pMVar21->data = (void *)auVar58._0_8_;
                              pMVar21->refcount = (int *)auVar58._8_8_;
                              pMVar21->elemsize = auVar50._0_8_;
                              pMVar21->elempack = auVar50._8_4_;
                              *(int *)&pMVar21->field_0x1c = auVar50._12_4_;
                              pMVar21 = (Mat *)&pMVar21->allocator;
                              pauVar15 = pauVar15 + local_228.cstep;
                              iVar28 = iVar28 + -1;
                            } while (iVar28 != 0);
                          }
                          if (local_228.elempack == 1 && 0 < iVar35) {
                            puVar49 = (undefined4 *)
                                      (local_228.cstep * lVar24 * local_228.elemsize + lVar42 +
                                      (long)local_228.data);
                            uVar16 = uVar36;
                            do {
                              *(undefined4 *)&pMVar21->data = *puVar49;
                              *(undefined4 *)((long)&pMVar21->data + 4) = puVar49[1];
                              pMVar21 = (Mat *)&pMVar21->refcount;
                              puVar49 = puVar49 + local_228.cstep;
                              auVar66._4_4_ = (int)uVar16 - 1;
                              uVar16 = (ulong)auVar66._4_4_;
                            } while (auVar66._4_4_ != 0);
                          }
                        }
LAB_001cee6b:
                        lVar31 = lVar41 + 2;
                        lVar30 = lVar41 + 3;
                        lVar42 = lVar42 + 8;
                        uVar16 = local_198;
                        lVar41 = lVar31;
                      } while (lVar30 < lVar38);
                    }
                    if ((int)lVar31 < (int)uVar44) {
                      iVar43 = iVar35 + 3;
                      if (-1 < iVar35) {
                        iVar43 = iVar35;
                      }
                      iVar29 = iVar35 + 7;
                      if (-1 < iVar35) {
                        iVar29 = iVar35;
                      }
                      iVar48 = iVar45 + 3;
                      iVar22 = iVar45 + 7;
                      if (-1 < iVar45) {
                        iVar48 = iVar45;
                        iVar22 = iVar45;
                      }
                      lVar42 = (long)(int)lVar31;
                      lVar31 = lVar10 * 4 + lVar42 * 4;
                      do {
                        if (local_228.elempack == 8) {
                          if (7 < iVar35) {
                            pauVar14 = (undefined1 (*) [32])
                                       ((long)local_228.data +
                                       (lVar42 + lVar10) * 0x20 +
                                       local_228.cstep * (long)(iVar22 >> 3) * local_228.elemsize);
                            iVar45 = iVar29 >> 3;
                            do {
                              *(undefined1 (*) [32])pMVar21 = *pauVar14;
                              pMVar21 = (Mat *)&pMVar21->allocator;
                              pauVar14 = pauVar14 + local_228.cstep;
                              iVar45 = iVar45 + -1;
                            } while (iVar45 != 0);
                            goto LAB_001cef57;
                          }
                        }
                        else {
LAB_001cef57:
                          if (local_228.elempack == 4) {
                            if (iVar35 < 4) goto LAB_001cefec;
                            pauVar15 = (undefined1 (*) [16])
                                       ((long)local_228.data +
                                       (lVar42 + lVar10) * 0x10 +
                                       local_228.cstep * (long)(iVar48 >> 2) * local_228.elemsize);
                            iVar45 = iVar43 >> 2;
                            do {
                              *(undefined1 (*) [16])pMVar21 = *pauVar15;
                              pMVar21 = (Mat *)&pMVar21->elemsize;
                              pauVar15 = pauVar15 + local_228.cstep;
                              iVar45 = iVar45 + -1;
                            } while (iVar45 != 0);
                          }
                          if (local_228.elempack == 1 && 0 < iVar35) {
                            puVar49 = (undefined4 *)
                                      (local_228.cstep * lVar24 * local_228.elemsize + lVar31 +
                                      (long)local_228.data);
                            uVar16 = uVar36;
                            do {
                              *(undefined4 *)&pMVar21->data = *puVar49;
                              pMVar21 = (Mat *)((long)&pMVar21->data + 4);
                              puVar49 = puVar49 + local_228.cstep;
                              auVar66._4_4_ = (int)uVar16 - 1;
                              uVar16 = (ulong)auVar66._4_4_;
                            } while (auVar66._4_4_ != 0);
                          }
                        }
LAB_001cefec:
                        lVar42 = lVar42 + 1;
                        lVar31 = lVar31 + 4;
                        uVar16 = local_198;
                      } while (lVar42 != lVar38);
                    }
                  }
                  iVar7 = iVar7 + 1;
                  pMVar21 = local_1d0;
                } while (iVar7 != (int)local_1d8);
              }
              local_118.cstep = 0;
              local_118.data = (void *)0x0;
              local_118.refcount._0_4_ = 0;
              local_118.refcount._4_4_ = 0;
              local_118.elemsize._0_1_ = 0;
              local_118.elemsize._1_7_ = 0;
              local_118.elempack = 0;
              local_118.allocator = (Allocator *)0x0;
              local_118.dims = 0;
              local_118.w = 0;
              local_118.h = 0;
              local_118.d = 0;
              local_118.c = 0;
              if ((int)local_1b0 < (int)uVar20) {
                Mat::create(&local_118,(int)local_70 * uVar9,1,(int)local_138,4,
                            opt->workspace_allocator);
                iVar7 = -100;
                if ((local_118.data != (void *)0x0) && ((long)local_118.c * local_118.cstep != 0))
                goto LAB_001cf35c;
              }
              else {
LAB_001cf35c:
                if (0 < (int)local_120) {
                  local_a8 = 0;
                  do {
                    iVar7 = TILE_M;
                    if ((int)local_1b0 < (int)uVar20) {
                      iVar43 = get_omp_thread_num();
                      local_98 = (undefined1 (*) [32])
                                 ((long)iVar43 * local_118.cstep *
                                  CONCAT71(local_118.elemsize._1_7_,(byte)local_118.elemsize) +
                                 (long)local_118.data);
                    }
                    else {
                      local_98 = (undefined1 (*) [32])0x0;
                    }
                    iVar43 = iVar7 * (int)local_a8;
                    uVar44 = (int)uVar16 - iVar43;
                    if (iVar7 < (int)uVar44) {
                      uVar44 = iVar7;
                    }
                    iVar7 = (int)local_a0;
                    if (0 < iVar7) {
                      local_190 = (long)iVar43;
                      local_128 = (long)(int)uVar44;
                      iVar45 = 0;
                      do {
                        uVar19 = iVar7 - iVar45;
                        if ((int)uVar9 < iVar7 - iVar45) {
                          uVar19 = uVar9;
                        }
                        iVar35 = (int)uVar20;
                        if (0 < iVar35) {
                          local_58 = (long)iVar45;
                          uVar36 = 0;
                          do {
                            iVar29 = (int)uVar36;
                            local_5c = iVar35 - iVar29;
                            uVar9 = (uint)local_1b0;
                            uVar16 = (ulong)local_5c;
                            if ((int)uVar9 < (int)local_5c) {
                              uVar16 = local_1b0 & 0xffffffff;
                            }
                            pauVar14 = (undefined1 (*) [32])(this->super_Convolution).bias_data.data
                            ;
                            sVar33 = (this->weight_sgemm_data).elemsize;
                            pauVar37 = (undefined1 (*) [32])
                                       ((long)(this->weight_sgemm_data).data +
                                       (long)(this->weight_sgemm_data).w * sVar33 *
                                       (long)(iVar29 / (int)uVar9) +
                                       (long)(iVar43 / TILE_M) * (this->weight_sgemm_data).cstep *
                                       sVar33);
                            local_1d8 = (undefined1 (*) [16])
                                        ((long)local_188.data +
                                        (long)local_188.w * local_188.elemsize *
                                        (long)(iVar29 / (int)uVar9) +
                                        (long)(iVar45 / TILE_N) * local_188.cstep *
                                        local_188.elemsize);
                            iVar17 = iVar29 + uVar9;
                            iVar48 = pMVar21->elempack;
                            local_90 = pMVar21->cstep;
                            iVar28 = (int)uVar16;
                            iVar22 = (int)local_90;
                            pauVar46 = local_98;
                            if ((int)uVar44 < 8) {
                              uVar23 = 0;
                            }
                            else {
                              local_40 = (long)(iVar48 * iVar45);
                              lVar10 = (long)(iVar22 * 2);
                              lVar24 = (long)(local_90 * 0x300000000) >> 0x20;
                              lVar38 = (long)(iVar22 * 4);
                              lVar31 = (long)((local_90 << 0x20) * 5) >> 0x20;
                              local_1c8 = (long)((local_90 << 0x21) * 3) >> 0x20;
                              lVar41 = (long)(local_90 * 0x700000000) >> 0x20;
                              local_138 = (ulong)(iVar22 * 3);
                              local_b0 = (ulong)(iVar22 * 5);
                              local_b8 = (ulong)(iVar22 * 6);
                              local_c0 = (ulong)(iVar22 * 7);
                              local_130 = (long)((local_90 << 0x20) + 0x100000000) >> 0x20;
                              local_c8 = (Option *)(long)(iVar22 * 2 + 1);
                              local_d0 = (Option *)(long)(iVar22 * 3 + 1);
                              local_68 = (long)(iVar22 * 4 + 1);
                              local_70 = (ulong)(iVar22 * 5 + 1);
                              local_78 = (long)(iVar22 * 6 + 1);
                              local_80 = (long)(iVar22 * 7 + 1);
                              local_48 = (long)(iVar28 * 8) * 4;
                              lVar42 = (long)iVar22;
                              local_1b8 = CONCAT44(local_1b8._4_4_,iVar48);
                              uVar23 = 0;
                              pauVar27 = pauVar14;
                              do {
                                local_38 = uVar23;
                                pauVar14 = (undefined1 (*) [32])
                                           ((long)(this->super_Convolution).bias_data.data +
                                           local_38 * 4 + local_190 * 4);
                                if (pauVar27 == (undefined1 (*) [32])0x0) {
                                  pauVar14 = pauVar27;
                                }
                                uVar47 = 0;
                                pauVar27 = (undefined1 (*) [32])
                                           ((long)local_1d0->data +
                                           local_40 * 4 + (local_38 + local_190) * lVar42 * 4);
                                pauVar15 = local_1d8;
                                if (0xb < (int)uVar19) {
                                  uVar25 = 0;
                                  do {
                                    if (iVar29 == 0) {
                                      if (pauVar14 == (undefined1 (*) [32])0x0) {
                                        auVar56 = ZEXT1664((undefined1  [16])0x0);
                                        auVar65 = ZEXT1664((undefined1  [16])0x0);
                                        auVar74 = ZEXT1664((undefined1  [16])0x0);
                                        auVar83 = ZEXT864(0) << 0x40;
                                        auVar87 = ZEXT864(0) << 0x40;
                                        auVar97 = ZEXT864(0) << 0x40;
                                        auVar103 = ZEXT864(0) << 0x40;
                                        auVar105 = ZEXT864(0) << 0x40;
                                        auVar108 = ZEXT864(0) << 0x40;
                                        auVar128 = ZEXT864(0) << 0x40;
                                        auVar134 = ZEXT864(0) << 0x40;
                                        auVar138 = ZEXT864(0) << 0x40;
                                      }
                                      else {
                                        auVar82 = *pauVar14;
                                        auVar56 = ZEXT3264(auVar82);
                                        auVar65 = ZEXT3264(auVar82);
                                        auVar74 = ZEXT3264(auVar82);
                                        auVar83 = ZEXT3264(auVar82);
                                        auVar87 = ZEXT3264(auVar82);
                                        auVar97 = ZEXT3264(auVar82);
                                        auVar103 = ZEXT3264(auVar82);
                                        auVar105 = ZEXT3264(auVar82);
                                        auVar108 = ZEXT3264(auVar82);
                                        auVar128 = ZEXT3264(auVar82);
                                        auVar134 = ZEXT3264(auVar82);
                                        auVar138 = ZEXT3264(auVar82);
                                      }
                                    }
                                    else {
                                      auVar138 = ZEXT3264(*pauVar46);
                                      auVar134 = ZEXT3264(pauVar46[1]);
                                      auVar128 = ZEXT3264(pauVar46[2]);
                                      auVar108 = ZEXT3264(pauVar46[3]);
                                      auVar105 = ZEXT3264(pauVar46[4]);
                                      auVar103 = ZEXT3264(pauVar46[5]);
                                      auVar97 = ZEXT3264(pauVar46[6]);
                                      auVar87 = ZEXT3264(pauVar46[7]);
                                      auVar83 = ZEXT3264(pauVar46[8]);
                                      auVar74 = ZEXT3264(pauVar46[9]);
                                      auVar65 = ZEXT3264(pauVar46[10]);
                                      auVar56 = ZEXT3264(pauVar46[0xb]);
                                    }
                                    auVar153 = auVar87._0_32_;
                                    auVar154 = auVar97._0_32_;
                                    auVar160 = auVar103._0_32_;
                                    auVar81 = auVar105._0_32_;
                                    auVar140 = auVar108._0_32_;
                                    auVar100 = auVar128._0_32_;
                                    auVar129 = auVar134._0_32_;
                                    auVar92 = auVar138._0_32_;
                                    auVar82 = auVar56._0_32_;
                                    auVar150 = auVar65._0_32_;
                                    auVar151 = auVar74._0_32_;
                                    auVar152 = auVar83._0_32_;
                                    pauVar26 = pauVar37;
                                    uVar23 = uVar16;
                                    if (0 < iVar28) {
                                      do {
                                        auVar82 = *pauVar26;
                                        uVar18 = *(undefined4 *)*pauVar15;
                                        auVar150._4_4_ = uVar18;
                                        auVar150._0_4_ = uVar18;
                                        auVar150._8_4_ = uVar18;
                                        auVar150._12_4_ = uVar18;
                                        auVar150._16_4_ = uVar18;
                                        auVar150._20_4_ = uVar18;
                                        auVar150._24_4_ = uVar18;
                                        auVar150._28_4_ = uVar18;
                                        auVar50 = vfmadd231ps_fma(auVar138._0_32_,auVar82,auVar150);
                                        auVar138 = ZEXT1664(auVar50);
                                        auVar92 = ZEXT1632(auVar50);
                                        uVar18 = *(undefined4 *)(*pauVar15 + 4);
                                        auVar151._4_4_ = uVar18;
                                        auVar151._0_4_ = uVar18;
                                        auVar151._8_4_ = uVar18;
                                        auVar151._12_4_ = uVar18;
                                        auVar151._16_4_ = uVar18;
                                        auVar151._20_4_ = uVar18;
                                        auVar151._24_4_ = uVar18;
                                        auVar151._28_4_ = uVar18;
                                        uVar18 = *(undefined4 *)(*pauVar15 + 8);
                                        auVar160._4_4_ = uVar18;
                                        auVar160._0_4_ = uVar18;
                                        auVar160._8_4_ = uVar18;
                                        auVar160._12_4_ = uVar18;
                                        auVar160._16_4_ = uVar18;
                                        auVar160._20_4_ = uVar18;
                                        auVar160._24_4_ = uVar18;
                                        auVar160._28_4_ = uVar18;
                                        auVar50 = vfmadd231ps_fma(auVar134._0_32_,auVar82,auVar151);
                                        auVar134 = ZEXT1664(auVar50);
                                        auVar129 = ZEXT1632(auVar50);
                                        auVar50 = vfmadd231ps_fma(auVar128._0_32_,auVar82,auVar160);
                                        auVar128 = ZEXT1664(auVar50);
                                        auVar100 = ZEXT1632(auVar50);
                                        uVar18 = *(undefined4 *)(*pauVar15 + 0xc);
                                        auVar152._4_4_ = uVar18;
                                        auVar152._0_4_ = uVar18;
                                        auVar152._8_4_ = uVar18;
                                        auVar152._12_4_ = uVar18;
                                        auVar152._16_4_ = uVar18;
                                        auVar152._20_4_ = uVar18;
                                        auVar152._24_4_ = uVar18;
                                        auVar152._28_4_ = uVar18;
                                        auVar50 = vfmadd231ps_fma(auVar108._0_32_,auVar82,auVar152);
                                        auVar108 = ZEXT1664(auVar50);
                                        auVar140 = ZEXT1632(auVar50);
                                        uVar18 = *(undefined4 *)pauVar15[1];
                                        auVar153._4_4_ = uVar18;
                                        auVar153._0_4_ = uVar18;
                                        auVar153._8_4_ = uVar18;
                                        auVar153._12_4_ = uVar18;
                                        auVar153._16_4_ = uVar18;
                                        auVar153._20_4_ = uVar18;
                                        auVar153._24_4_ = uVar18;
                                        auVar153._28_4_ = uVar18;
                                        auVar50 = vfmadd231ps_fma(auVar105._0_32_,auVar82,auVar153);
                                        auVar105 = ZEXT1664(auVar50);
                                        auVar81 = ZEXT1632(auVar50);
                                        uVar18 = *(undefined4 *)(pauVar15[1] + 4);
                                        auVar154._4_4_ = uVar18;
                                        auVar154._0_4_ = uVar18;
                                        auVar154._8_4_ = uVar18;
                                        auVar154._12_4_ = uVar18;
                                        auVar154._16_4_ = uVar18;
                                        auVar154._20_4_ = uVar18;
                                        auVar154._24_4_ = uVar18;
                                        auVar154._28_4_ = uVar18;
                                        uVar18 = *(undefined4 *)(pauVar15[1] + 8);
                                        auVar161._4_4_ = uVar18;
                                        auVar161._0_4_ = uVar18;
                                        auVar161._8_4_ = uVar18;
                                        auVar161._12_4_ = uVar18;
                                        auVar161._16_4_ = uVar18;
                                        auVar161._20_4_ = uVar18;
                                        auVar161._24_4_ = uVar18;
                                        auVar161._28_4_ = uVar18;
                                        auVar50 = vfmadd231ps_fma(auVar103._0_32_,auVar82,auVar154);
                                        auVar103 = ZEXT1664(auVar50);
                                        auVar160 = ZEXT1632(auVar50);
                                        auVar50 = vfmadd231ps_fma(auVar97._0_32_,auVar82,auVar161);
                                        auVar97 = ZEXT1664(auVar50);
                                        auVar154 = ZEXT1632(auVar50);
                                        uVar18 = *(undefined4 *)(pauVar15[1] + 0xc);
                                        auVar155._4_4_ = uVar18;
                                        auVar155._0_4_ = uVar18;
                                        auVar155._8_4_ = uVar18;
                                        auVar155._12_4_ = uVar18;
                                        auVar155._16_4_ = uVar18;
                                        auVar155._20_4_ = uVar18;
                                        auVar155._24_4_ = uVar18;
                                        auVar155._28_4_ = uVar18;
                                        auVar50 = vfmadd231ps_fma(auVar87._0_32_,auVar82,auVar155);
                                        auVar87 = ZEXT1664(auVar50);
                                        auVar153 = ZEXT1632(auVar50);
                                        uVar18 = *(undefined4 *)pauVar15[2];
                                        auVar156._4_4_ = uVar18;
                                        auVar156._0_4_ = uVar18;
                                        auVar156._8_4_ = uVar18;
                                        auVar156._12_4_ = uVar18;
                                        auVar156._16_4_ = uVar18;
                                        auVar156._20_4_ = uVar18;
                                        auVar156._24_4_ = uVar18;
                                        auVar156._28_4_ = uVar18;
                                        auVar50 = vfmadd231ps_fma(auVar83._0_32_,auVar82,auVar156);
                                        auVar83 = ZEXT1664(auVar50);
                                        auVar152 = ZEXT1632(auVar50);
                                        uVar18 = *(undefined4 *)(pauVar15[2] + 4);
                                        auVar157._4_4_ = uVar18;
                                        auVar157._0_4_ = uVar18;
                                        auVar157._8_4_ = uVar18;
                                        auVar157._12_4_ = uVar18;
                                        auVar157._16_4_ = uVar18;
                                        auVar157._20_4_ = uVar18;
                                        auVar157._24_4_ = uVar18;
                                        auVar157._28_4_ = uVar18;
                                        uVar18 = *(undefined4 *)(pauVar15[2] + 8);
                                        auVar162._4_4_ = uVar18;
                                        auVar162._0_4_ = uVar18;
                                        auVar162._8_4_ = uVar18;
                                        auVar162._12_4_ = uVar18;
                                        auVar162._16_4_ = uVar18;
                                        auVar162._20_4_ = uVar18;
                                        auVar162._24_4_ = uVar18;
                                        auVar162._28_4_ = uVar18;
                                        auVar50 = vfmadd231ps_fma(auVar74._0_32_,auVar82,auVar157);
                                        auVar74 = ZEXT1664(auVar50);
                                        auVar151 = ZEXT1632(auVar50);
                                        auVar50 = vfmadd231ps_fma(auVar65._0_32_,auVar82,auVar162);
                                        auVar65 = ZEXT1664(auVar50);
                                        auVar150 = ZEXT1632(auVar50);
                                        uVar18 = *(undefined4 *)(pauVar15[2] + 0xc);
                                        auVar158._4_4_ = uVar18;
                                        auVar158._0_4_ = uVar18;
                                        auVar158._8_4_ = uVar18;
                                        auVar158._12_4_ = uVar18;
                                        auVar158._16_4_ = uVar18;
                                        auVar158._20_4_ = uVar18;
                                        auVar158._24_4_ = uVar18;
                                        auVar158._28_4_ = uVar18;
                                        auVar50 = vfmadd231ps_fma(auVar56._0_32_,auVar82,auVar158);
                                        auVar56 = ZEXT1664(auVar50);
                                        auVar82 = ZEXT1632(auVar50);
                                        pauVar15 = pauVar15 + 3;
                                        auVar66._4_4_ = (int)uVar23 - 1;
                                        pauVar26 = pauVar26 + 1;
                                        uVar23 = (ulong)auVar66._4_4_;
                                      } while (auVar66._4_4_ != 0);
                                    }
                                    if (iVar17 < iVar35) {
                                      *pauVar46 = auVar92;
                                      pauVar46[1] = auVar129;
                                      pauVar46[2] = auVar100;
                                      pauVar46[3] = auVar140;
                                      pauVar46[4] = auVar81;
                                      pauVar46[5] = auVar160;
                                      pauVar46[6] = auVar154;
                                      pauVar46[7] = auVar153;
                                      pauVar46[8] = auVar152;
                                      pauVar46[9] = auVar151;
                                      pauVar46[10] = auVar150;
                                      pauVar46[0xb] = auVar82;
                                    }
                                    else {
                                      auVar57 = auVar152._0_16_;
                                      auVar66 = auVar151._0_16_;
                                      auVar58 = auVar150._0_16_;
                                      auVar50 = auVar82._0_16_;
                                      if (iVar48 == 1) {
                                        auVar155 = vunpcklps_avx(auVar92,auVar129);
                                        auVar129 = vunpckhps_avx(auVar92,auVar129);
                                        auVar156 = vunpcklps_avx(auVar100,auVar140);
                                        auVar140 = vunpckhps_avx(auVar100,auVar140);
                                        auVar157 = vunpcklps_avx(auVar81,auVar160);
                                        auVar81 = vunpckhps_avx(auVar81,auVar160);
                                        auVar160 = vunpcklps_avx(auVar154,auVar153);
                                        auVar100 = vunpckhps_avx(auVar154,auVar153);
                                        auVar92 = vunpcklpd_avx(auVar155,auVar156);
                                        auVar153 = vunpckhpd_avx(auVar155,auVar156);
                                        auVar155 = vunpcklpd_avx(auVar129,auVar140);
                                        auVar154 = vunpckhpd_avx(auVar129,auVar140);
                                        auVar140 = vunpcklpd_avx(auVar157,auVar160);
                                        auVar160 = vunpckhpd_avx(auVar157,auVar160);
                                        auVar129 = vunpcklpd_avx(auVar81,auVar100);
                                        auVar81 = vunpckhpd_avx(auVar81,auVar100);
                                        auVar101._16_16_ = auVar140._0_16_;
                                        auVar101._0_16_ = auVar92._0_16_;
                                        auVar159._16_16_ = auVar160._0_16_;
                                        auVar159._0_16_ = auVar153._0_16_;
                                        auVar163._16_16_ = auVar129._0_16_;
                                        auVar163._0_16_ = auVar155._0_16_;
                                        auVar164._16_16_ = auVar81._0_16_;
                                        auVar164._0_16_ = auVar154._0_16_;
                                        auVar140 = vperm2f128_avx(auVar92,auVar140,0x31);
                                        auVar153 = vperm2f128_avx(auVar153,auVar160,0x31);
                                        auVar160 = vperm2f128_avx(auVar155,auVar129,0x31);
                                        auVar154 = vperm2f128_avx(auVar154,auVar81,0x31);
                                        *pauVar27 = auVar101;
                                        *(undefined1 (*) [32])(*pauVar27 + lVar42 * 4) = auVar159;
                                        *(undefined1 (*) [32])(*pauVar27 + lVar10 * 4) = auVar163;
                                        *(undefined1 (*) [32])(*pauVar27 + lVar24 * 4) = auVar164;
                                        *(undefined1 (*) [32])(*pauVar27 + lVar38 * 4) = auVar140;
                                        *(undefined1 (*) [32])(*pauVar27 + lVar31 * 4) = auVar153;
                                        *(undefined1 (*) [32])(*pauVar27 + local_1c8 * 4) = auVar160
                                        ;
                                        *(undefined1 (*) [32])(*pauVar27 + lVar41 * 4) = auVar154;
                                        auVar84 = vunpcklps_avx(auVar57,auVar66);
                                        auVar106 = vunpcklps_avx(auVar58,auVar50);
                                        auVar66 = vunpckhps_avx(auVar57,auVar66);
                                        auVar57 = vunpckhps_avx(auVar58,auVar50);
                                        auVar50 = vmovlhps_avx(auVar84,auVar106);
                                        auVar84 = vunpckhpd_avx(auVar84,auVar106);
                                        auVar58 = vmovlhps_avx(auVar66,auVar57);
                                        auVar106 = vunpckhpd_avx(auVar66,auVar57);
                                        auVar57 = vunpcklps_avx(auVar152._16_16_,auVar151._16_16_);
                                        auVar139 = vunpcklps_avx(auVar150._16_16_,auVar82._16_16_);
                                        auVar142 = vunpckhps_avx(auVar152._16_16_,auVar151._16_16_);
                                        auVar143 = vunpckhps_avx(auVar150._16_16_,auVar82._16_16_);
                                        auVar66 = vmovlhps_avx(auVar57,auVar139);
                                        auVar139 = vunpckhpd_avx(auVar57,auVar139);
                                        auVar57 = vmovlhps_avx(auVar142,auVar143);
                                        auVar142 = vunpckhpd_avx(auVar142,auVar143);
                                        *(undefined1 (*) [16])pauVar27[1] = auVar50;
                                        *(undefined1 (*) [16])(pauVar27[1] + lVar42 * 4) = auVar84;
                                        *(undefined1 (*) [16])(pauVar27[1] + lVar10 * 4) = auVar58;
                                        *(undefined1 (*) [16])(pauVar27[1] + lVar24 * 4) = auVar106;
                                        *(undefined1 (*) [16])(pauVar27[1] + lVar38 * 4) = auVar66;
                                        *(undefined1 (*) [16])(pauVar27[1] + lVar31 * 4) = auVar139;
                                        *(undefined1 (*) [16])(pauVar27[1] + local_1c8 * 4) =
                                             auVar57;
                                        *(undefined1 (*) [16])(pauVar27[1] + lVar41 * 4) = auVar142;
                                        pauVar27 = (undefined1 (*) [32])(pauVar27[1] + 0x10);
                                      }
                                      else if (iVar48 == 4) {
                                        auVar141._16_16_ = auVar129._0_16_;
                                        auVar141._0_16_ = auVar92._0_16_;
                                        auVar129 = vperm2f128_avx(auVar92,auVar129,0x31);
                                        auVar135._16_16_ = auVar140._0_16_;
                                        auVar135._0_16_ = auVar100._0_16_;
                                        auVar140 = vperm2f128_avx(auVar100,auVar140,0x31);
                                        auVar119._16_16_ = auVar160._0_16_;
                                        auVar119._0_16_ = auVar81._0_16_;
                                        auVar160 = vperm2f128_avx(auVar81,auVar160,0x31);
                                        auVar104._16_16_ = auVar153._0_16_;
                                        auVar104._0_16_ = auVar154._0_16_;
                                        auVar153 = vperm2f128_avx(auVar154,auVar153,0x31);
                                        auVar92._16_16_ = auVar66;
                                        auVar92._0_16_ = auVar57;
                                        auVar151 = vperm2f128_avx(auVar152,auVar151,0x31);
                                        auVar81._16_16_ = auVar50;
                                        auVar81._0_16_ = auVar58;
                                        auVar82 = vperm2f128_avx(auVar150,auVar82,0x31);
                                        *pauVar27 = auVar141;
                                        pauVar27[1] = auVar135;
                                        pauVar27[2] = auVar119;
                                        pauVar27[3] = auVar104;
                                        pauVar27[4] = auVar92;
                                        pauVar27[5] = auVar81;
                                        *(undefined1 (*) [32])(*pauVar27 + lVar38 * 4) = auVar129;
                                        *(undefined1 (*) [32])(pauVar27[1] + lVar38 * 4) = auVar140;
                                        *(undefined1 (*) [32])(pauVar27[2] + lVar38 * 4) = auVar160;
                                        *(undefined1 (*) [32])(pauVar27[3] + lVar38 * 4) = auVar153;
                                        *(undefined1 (*) [32])(pauVar27[4] + lVar38 * 4) = auVar151;
                                        *(undefined1 (*) [32])(pauVar27[5] + lVar38 * 4) = auVar82;
                                        pauVar27 = pauVar27 + 6;
                                      }
                                      else if (iVar48 == 8) {
                                        *pauVar27 = auVar92;
                                        pauVar27[1] = auVar129;
                                        pauVar27[2] = auVar100;
                                        pauVar27[3] = auVar140;
                                        pauVar27[4] = auVar81;
                                        pauVar27[5] = auVar160;
                                        pauVar27[6] = auVar154;
                                        pauVar27[7] = auVar153;
                                        pauVar27[8] = auVar152;
                                        pauVar27[9] = auVar151;
                                        pauVar27[10] = auVar150;
                                        pauVar27[0xb] = auVar82;
                                        pauVar27 = pauVar27 + 0xc;
                                      }
                                    }
                                    pauVar46 = pauVar46 + 0xc;
                                    uVar47 = uVar25 + 0xc;
                                    iVar8 = uVar25 + 0x17;
                                    uVar25 = uVar47;
                                  } while (iVar8 < (int)uVar19);
                                }
                                iVar8 = uVar47 + 7;
                                while (iVar8 < (int)uVar19) {
                                  if (iVar29 == 0) {
                                    if (pauVar14 == (undefined1 (*) [32])0x0) {
                                      auVar56 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar65 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar74 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar83 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar87 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar97 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar103 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar105 = ZEXT1664(ZEXT816(0) << 0x40);
                                    }
                                    else {
                                      auVar82 = *pauVar14;
                                      auVar56 = ZEXT3264(auVar82);
                                      auVar65 = ZEXT3264(auVar82);
                                      auVar74 = ZEXT3264(auVar82);
                                      auVar83 = ZEXT3264(auVar82);
                                      auVar87 = ZEXT3264(auVar82);
                                      auVar97 = ZEXT3264(auVar82);
                                      auVar103 = ZEXT3264(auVar82);
                                      auVar105 = ZEXT3264(auVar82);
                                    }
                                  }
                                  else {
                                    auVar105 = ZEXT3264(*pauVar46);
                                    auVar103 = ZEXT3264(pauVar46[1]);
                                    auVar97 = ZEXT3264(pauVar46[2]);
                                    auVar87 = ZEXT3264(pauVar46[3]);
                                    auVar83 = ZEXT3264(pauVar46[4]);
                                    auVar74 = ZEXT3264(pauVar46[5]);
                                    auVar65 = ZEXT3264(pauVar46[6]);
                                    auVar56 = ZEXT3264(pauVar46[7]);
                                  }
                                  auVar82 = auVar56._0_32_;
                                  auVar150 = auVar65._0_32_;
                                  auVar151 = auVar74._0_32_;
                                  auVar152 = auVar83._0_32_;
                                  auVar153 = auVar87._0_32_;
                                  auVar154 = auVar97._0_32_;
                                  auVar160 = auVar103._0_32_;
                                  auVar81 = auVar105._0_32_;
                                  if (0 < iVar28) {
                                    lVar30 = 0;
                                    uVar23 = uVar16;
                                    do {
                                      lVar12 = lVar30;
                                      auVar82 = *(undefined1 (*) [32])(*pauVar37 + lVar12);
                                      uVar18 = *(undefined4 *)(*pauVar15 + lVar12);
                                      auVar120._4_4_ = uVar18;
                                      auVar120._0_4_ = uVar18;
                                      auVar120._8_4_ = uVar18;
                                      auVar120._12_4_ = uVar18;
                                      auVar120._16_4_ = uVar18;
                                      auVar120._20_4_ = uVar18;
                                      auVar120._24_4_ = uVar18;
                                      auVar120._28_4_ = uVar18;
                                      auVar50 = vfmadd231ps_fma(auVar105._0_32_,auVar82,auVar120);
                                      auVar105 = ZEXT1664(auVar50);
                                      auVar81 = ZEXT1632(auVar50);
                                      uVar18 = *(undefined4 *)(*pauVar15 + lVar12 + 4);
                                      auVar121._4_4_ = uVar18;
                                      auVar121._0_4_ = uVar18;
                                      auVar121._8_4_ = uVar18;
                                      auVar121._12_4_ = uVar18;
                                      auVar121._16_4_ = uVar18;
                                      auVar121._20_4_ = uVar18;
                                      auVar121._24_4_ = uVar18;
                                      auVar121._28_4_ = uVar18;
                                      auVar50 = vfmadd231ps_fma(auVar103._0_32_,auVar82,auVar121);
                                      auVar103 = ZEXT1664(auVar50);
                                      auVar160 = ZEXT1632(auVar50);
                                      uVar18 = *(undefined4 *)(*pauVar15 + lVar12 + 8);
                                      auVar122._4_4_ = uVar18;
                                      auVar122._0_4_ = uVar18;
                                      auVar122._8_4_ = uVar18;
                                      auVar122._12_4_ = uVar18;
                                      auVar122._16_4_ = uVar18;
                                      auVar122._20_4_ = uVar18;
                                      auVar122._24_4_ = uVar18;
                                      auVar122._28_4_ = uVar18;
                                      uVar18 = *(undefined4 *)(*pauVar15 + lVar12 + 0xc);
                                      auVar130._4_4_ = uVar18;
                                      auVar130._0_4_ = uVar18;
                                      auVar130._8_4_ = uVar18;
                                      auVar130._12_4_ = uVar18;
                                      auVar130._16_4_ = uVar18;
                                      auVar130._20_4_ = uVar18;
                                      auVar130._24_4_ = uVar18;
                                      auVar130._28_4_ = uVar18;
                                      auVar50 = vfmadd231ps_fma(auVar97._0_32_,auVar82,auVar122);
                                      auVar97 = ZEXT1664(auVar50);
                                      auVar154 = ZEXT1632(auVar50);
                                      auVar50 = vfmadd231ps_fma(auVar87._0_32_,auVar82,auVar130);
                                      auVar87 = ZEXT1664(auVar50);
                                      auVar153 = ZEXT1632(auVar50);
                                      uVar18 = *(undefined4 *)(pauVar15[1] + lVar12);
                                      auVar123._4_4_ = uVar18;
                                      auVar123._0_4_ = uVar18;
                                      auVar123._8_4_ = uVar18;
                                      auVar123._12_4_ = uVar18;
                                      auVar123._16_4_ = uVar18;
                                      auVar123._20_4_ = uVar18;
                                      auVar123._24_4_ = uVar18;
                                      auVar123._28_4_ = uVar18;
                                      auVar50 = vfmadd231ps_fma(auVar83._0_32_,auVar82,auVar123);
                                      auVar83 = ZEXT1664(auVar50);
                                      auVar152 = ZEXT1632(auVar50);
                                      uVar18 = *(undefined4 *)(pauVar15[1] + lVar12 + 4);
                                      auVar124._4_4_ = uVar18;
                                      auVar124._0_4_ = uVar18;
                                      auVar124._8_4_ = uVar18;
                                      auVar124._12_4_ = uVar18;
                                      auVar124._16_4_ = uVar18;
                                      auVar124._20_4_ = uVar18;
                                      auVar124._24_4_ = uVar18;
                                      auVar124._28_4_ = uVar18;
                                      auVar50 = vfmadd231ps_fma(auVar74._0_32_,auVar82,auVar124);
                                      auVar74 = ZEXT1664(auVar50);
                                      auVar151 = ZEXT1632(auVar50);
                                      uVar18 = *(undefined4 *)(pauVar15[1] + lVar12 + 8);
                                      auVar125._4_4_ = uVar18;
                                      auVar125._0_4_ = uVar18;
                                      auVar125._8_4_ = uVar18;
                                      auVar125._12_4_ = uVar18;
                                      auVar125._16_4_ = uVar18;
                                      auVar125._20_4_ = uVar18;
                                      auVar125._24_4_ = uVar18;
                                      auVar125._28_4_ = uVar18;
                                      uVar18 = *(undefined4 *)(pauVar15[1] + lVar12 + 0xc);
                                      auVar131._4_4_ = uVar18;
                                      auVar131._0_4_ = uVar18;
                                      auVar131._8_4_ = uVar18;
                                      auVar131._12_4_ = uVar18;
                                      auVar131._16_4_ = uVar18;
                                      auVar131._20_4_ = uVar18;
                                      auVar131._24_4_ = uVar18;
                                      auVar131._28_4_ = uVar18;
                                      auVar50 = vfmadd231ps_fma(auVar65._0_32_,auVar82,auVar125);
                                      auVar65 = ZEXT1664(auVar50);
                                      auVar150 = ZEXT1632(auVar50);
                                      auVar50 = vfmadd231ps_fma(auVar56._0_32_,auVar82,auVar131);
                                      auVar56 = ZEXT1664(auVar50);
                                      auVar82 = ZEXT1632(auVar50);
                                      auVar66._4_4_ = (int)uVar23 - 1;
                                      uVar23 = (ulong)auVar66._4_4_;
                                      lVar30 = lVar12 + 0x20;
                                    } while (auVar66._4_4_ != 0);
                                    pauVar15 = (undefined1 (*) [16])(pauVar15[2] + lVar12);
                                  }
                                  if (iVar17 < iVar35) {
                                    *pauVar46 = auVar81;
                                    pauVar46[1] = auVar160;
                                    pauVar46[2] = auVar154;
                                    pauVar46[3] = auVar153;
                                    pauVar46[4] = auVar152;
                                    pauVar46[5] = auVar151;
                                    pauVar46[6] = auVar150;
                                    pauVar46[7] = auVar82;
                                  }
                                  else if (iVar48 == 1) {
                                    auVar140 = vunpcklps_avx(auVar81,auVar160);
                                    auVar160 = vunpckhps_avx(auVar81,auVar160);
                                    auVar100 = vunpcklps_avx(auVar154,auVar153);
                                    auVar153 = vunpckhps_avx(auVar154,auVar153);
                                    auVar129 = vunpcklps_avx(auVar152,auVar151);
                                    auVar152 = vunpckhps_avx(auVar152,auVar151);
                                    auVar151 = vunpcklps_avx(auVar150,auVar82);
                                    auVar154 = vunpckhps_avx(auVar150,auVar82);
                                    auVar81 = vunpcklpd_avx(auVar140,auVar100);
                                    auVar82 = vunpckhpd_avx(auVar140,auVar100);
                                    auVar140 = vunpcklpd_avx(auVar160,auVar153);
                                    auVar150 = vunpckhpd_avx(auVar160,auVar153);
                                    auVar153 = vunpcklpd_avx(auVar129,auVar151);
                                    auVar151 = vunpckhpd_avx(auVar129,auVar151);
                                    auVar160 = vunpcklpd_avx(auVar152,auVar154);
                                    auVar152 = vunpckhpd_avx(auVar152,auVar154);
                                    auVar72._16_16_ = auVar153._0_16_;
                                    auVar72._0_16_ = auVar81._0_16_;
                                    auVar127._16_16_ = auVar151._0_16_;
                                    auVar127._0_16_ = auVar82._0_16_;
                                    auVar133._16_16_ = auVar160._0_16_;
                                    auVar133._0_16_ = auVar140._0_16_;
                                    auVar137._16_16_ = auVar152._0_16_;
                                    auVar137._0_16_ = auVar150._0_16_;
                                    auVar153 = vperm2f128_avx(auVar81,auVar153,0x31);
                                    auVar82 = vperm2f128_avx(auVar82,auVar151,0x31);
                                    auVar151 = vperm2f128_avx(auVar140,auVar160,0x31);
                                    auVar150 = vperm2f128_avx(auVar150,auVar152,0x31);
                                    *pauVar27 = auVar72;
                                    *(undefined1 (*) [32])(*pauVar27 + lVar42 * 4) = auVar127;
                                    *(undefined1 (*) [32])(*pauVar27 + lVar10 * 4) = auVar133;
                                    *(undefined1 (*) [32])(*pauVar27 + lVar24 * 4) = auVar137;
                                    *(undefined1 (*) [32])(*pauVar27 + lVar38 * 4) = auVar153;
                                    *(undefined1 (*) [32])(*pauVar27 + lVar31 * 4) = auVar82;
                                    *(undefined1 (*) [32])(*pauVar27 + local_1c8 * 4) = auVar151;
                                    *(undefined1 (*) [32])(*pauVar27 + lVar41 * 4) = auVar150;
                                    pauVar27 = pauVar27 + 1;
                                  }
                                  else if (iVar48 == 4) {
                                    auVar107._16_16_ = auVar160._0_16_;
                                    auVar107._0_16_ = auVar81._0_16_;
                                    auVar126._16_16_ = auVar153._0_16_;
                                    auVar126._0_16_ = auVar154._0_16_;
                                    auVar132._16_16_ = auVar151._0_16_;
                                    auVar132._0_16_ = auVar152._0_16_;
                                    auVar136._16_16_ = auVar82._0_16_;
                                    auVar136._0_16_ = auVar150._0_16_;
                                    auVar160 = vperm2f128_avx(auVar81,auVar160,0x31);
                                    auVar153 = vperm2f128_avx(auVar154,auVar153,0x31);
                                    auVar151 = vperm2f128_avx(auVar152,auVar151,0x31);
                                    auVar82 = vperm2f128_avx(auVar150,auVar82,0x31);
                                    *pauVar27 = auVar107;
                                    pauVar27[1] = auVar126;
                                    pauVar27[2] = auVar132;
                                    pauVar27[3] = auVar136;
                                    *(undefined1 (*) [32])(*pauVar27 + lVar38 * 4) = auVar160;
                                    *(undefined1 (*) [32])(pauVar27[1] + lVar38 * 4) = auVar153;
                                    *(undefined1 (*) [32])(pauVar27[2] + lVar38 * 4) = auVar151;
                                    *(undefined1 (*) [32])(pauVar27[3] + lVar38 * 4) = auVar82;
                                    pauVar27 = pauVar27 + 4;
                                  }
                                  else if (iVar48 == 8) {
                                    *pauVar27 = auVar81;
                                    pauVar27[1] = auVar160;
                                    pauVar27[2] = auVar154;
                                    pauVar27[3] = auVar153;
                                    pauVar27[4] = auVar152;
                                    pauVar27[5] = auVar151;
                                    pauVar27[6] = auVar150;
                                    pauVar27[7] = auVar82;
                                    pauVar27 = pauVar27 + 8;
                                  }
                                  pauVar46 = pauVar46 + 8;
                                  iVar8 = uVar47 + 0xf;
                                  uVar47 = uVar47 + 8;
                                }
                                auVar66._4_4_ = uVar47 | 3;
                                while ((int)auVar66._4_4_ < (int)uVar19) {
                                  if (iVar29 == 0) {
                                    if (pauVar14 == (undefined1 (*) [32])0x0) {
                                      auVar56 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar65 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar74 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar83 = ZEXT1664(ZEXT816(0) << 0x40);
                                    }
                                    else {
                                      auVar82 = *pauVar14;
                                      auVar56 = ZEXT3264(auVar82);
                                      auVar65 = ZEXT3264(auVar82);
                                      auVar74 = ZEXT3264(auVar82);
                                      auVar83 = ZEXT3264(auVar82);
                                    }
                                  }
                                  else {
                                    auVar83 = ZEXT3264(*pauVar46);
                                    auVar74 = ZEXT3264(pauVar46[1]);
                                    auVar65 = ZEXT3264(pauVar46[2]);
                                    auVar56 = ZEXT3264(pauVar46[3]);
                                  }
                                  auVar82 = auVar56._0_32_;
                                  auVar150 = auVar65._0_32_;
                                  auVar151 = auVar74._0_32_;
                                  auVar152 = auVar83._0_32_;
                                  if (0 < iVar28) {
                                    lVar30 = 0;
                                    uVar23 = uVar16;
                                    do {
                                      lVar12 = lVar30;
                                      auVar82 = *(undefined1 (*) [32])(*pauVar37 + lVar12 * 2);
                                      uVar18 = *(undefined4 *)(*pauVar15 + lVar12);
                                      auVar93._4_4_ = uVar18;
                                      auVar93._0_4_ = uVar18;
                                      auVar93._8_4_ = uVar18;
                                      auVar93._12_4_ = uVar18;
                                      auVar93._16_4_ = uVar18;
                                      auVar93._20_4_ = uVar18;
                                      auVar93._24_4_ = uVar18;
                                      auVar93._28_4_ = uVar18;
                                      auVar50 = vfmadd231ps_fma(auVar83._0_32_,auVar82,auVar93);
                                      auVar83 = ZEXT1664(auVar50);
                                      auVar152 = ZEXT1632(auVar50);
                                      uVar18 = *(undefined4 *)(*pauVar15 + lVar12 + 4);
                                      auVar94._4_4_ = uVar18;
                                      auVar94._0_4_ = uVar18;
                                      auVar94._8_4_ = uVar18;
                                      auVar94._12_4_ = uVar18;
                                      auVar94._16_4_ = uVar18;
                                      auVar94._20_4_ = uVar18;
                                      auVar94._24_4_ = uVar18;
                                      auVar94._28_4_ = uVar18;
                                      auVar50 = vfmadd231ps_fma(auVar74._0_32_,auVar82,auVar94);
                                      auVar74 = ZEXT1664(auVar50);
                                      auVar151 = ZEXT1632(auVar50);
                                      uVar18 = *(undefined4 *)(*pauVar15 + lVar12 + 8);
                                      auVar95._4_4_ = uVar18;
                                      auVar95._0_4_ = uVar18;
                                      auVar95._8_4_ = uVar18;
                                      auVar95._12_4_ = uVar18;
                                      auVar95._16_4_ = uVar18;
                                      auVar95._20_4_ = uVar18;
                                      auVar95._24_4_ = uVar18;
                                      auVar95._28_4_ = uVar18;
                                      uVar18 = *(undefined4 *)(*pauVar15 + lVar12 + 0xc);
                                      auVar102._4_4_ = uVar18;
                                      auVar102._0_4_ = uVar18;
                                      auVar102._8_4_ = uVar18;
                                      auVar102._12_4_ = uVar18;
                                      auVar102._16_4_ = uVar18;
                                      auVar102._20_4_ = uVar18;
                                      auVar102._24_4_ = uVar18;
                                      auVar102._28_4_ = uVar18;
                                      auVar50 = vfmadd231ps_fma(auVar65._0_32_,auVar82,auVar95);
                                      auVar65 = ZEXT1664(auVar50);
                                      auVar150 = ZEXT1632(auVar50);
                                      auVar50 = vfmadd231ps_fma(auVar56._0_32_,auVar82,auVar102);
                                      auVar56 = ZEXT1664(auVar50);
                                      auVar82 = ZEXT1632(auVar50);
                                      auVar66._4_4_ = (int)uVar23 - 1;
                                      uVar23 = (ulong)auVar66._4_4_;
                                      lVar30 = lVar12 + 0x10;
                                    } while (auVar66._4_4_ != 0);
                                    pauVar15 = (undefined1 (*) [16])(pauVar15[1] + lVar12);
                                  }
                                  if (iVar17 < iVar35) {
                                    *pauVar46 = auVar152;
                                    pauVar46[1] = auVar151;
                                    pauVar46[2] = auVar150;
                                    pauVar46[3] = auVar82;
                                  }
                                  else {
                                    auVar57 = auVar152._0_16_;
                                    auVar66 = auVar151._0_16_;
                                    auVar58 = auVar150._0_16_;
                                    auVar50 = auVar82._0_16_;
                                    if (iVar48 == 1) {
                                      auVar84 = vunpcklps_avx(auVar57,auVar66);
                                      auVar106 = vunpcklps_avx(auVar58,auVar50);
                                      auVar66 = vunpckhps_avx(auVar57,auVar66);
                                      auVar57 = vunpckhps_avx(auVar58,auVar50);
                                      auVar50 = vmovlhps_avx(auVar84,auVar106);
                                      auVar84 = vunpckhpd_avx(auVar84,auVar106);
                                      auVar58 = vmovlhps_avx(auVar66,auVar57);
                                      auVar106 = vunpckhpd_avx(auVar66,auVar57);
                                      auVar57 = vunpcklps_avx(auVar152._16_16_,auVar151._16_16_);
                                      auVar139 = vunpcklps_avx(auVar150._16_16_,auVar82._16_16_);
                                      auVar142 = vunpckhps_avx(auVar152._16_16_,auVar151._16_16_);
                                      auVar143 = vunpckhps_avx(auVar150._16_16_,auVar82._16_16_);
                                      auVar66 = vmovlhps_avx(auVar57,auVar139);
                                      auVar139 = vunpckhpd_avx(auVar57,auVar139);
                                      auVar57 = vmovlhps_avx(auVar142,auVar143);
                                      auVar142 = vunpckhpd_avx(auVar142,auVar143);
                                      *(undefined1 (*) [16])*pauVar27 = auVar50;
                                      *(undefined1 (*) [16])(*pauVar27 + lVar42 * 4) = auVar84;
                                      *(undefined1 (*) [16])(*pauVar27 + lVar10 * 4) = auVar58;
                                      *(undefined1 (*) [16])(*pauVar27 + lVar24 * 4) = auVar106;
                                      *(undefined1 (*) [16])(*pauVar27 + lVar38 * 4) = auVar66;
                                      *(undefined1 (*) [16])(*pauVar27 + lVar31 * 4) = auVar139;
                                      *(undefined1 (*) [16])(*pauVar27 + local_1c8 * 4) = auVar57;
                                      *(undefined1 (*) [16])(*pauVar27 + lVar41 * 4) = auVar142;
                                      pauVar27 = (undefined1 (*) [32])(*pauVar27 + 0x10);
                                    }
                                    else if (iVar48 == 4) {
                                      auVar85._16_16_ = auVar66;
                                      auVar85._0_16_ = auVar57;
                                      auVar96._16_16_ = auVar50;
                                      auVar96._0_16_ = auVar58;
                                      auVar151 = vperm2f128_avx(auVar152,auVar151,0x31);
                                      auVar82 = vperm2f128_avx(auVar150,auVar82,0x31);
                                      *pauVar27 = auVar85;
                                      pauVar27[1] = auVar96;
                                      *(undefined1 (*) [32])(*pauVar27 + lVar38 * 4) = auVar151;
                                      *(undefined1 (*) [32])(pauVar27[1] + lVar38 * 4) = auVar82;
                                      pauVar27 = pauVar27 + 2;
                                    }
                                    else if (iVar48 == 8) {
                                      *pauVar27 = auVar152;
                                      pauVar27[1] = auVar151;
                                      pauVar27[2] = auVar150;
                                      pauVar27[3] = auVar82;
                                      pauVar27 = pauVar27 + 4;
                                    }
                                  }
                                  pauVar46 = pauVar46 + 4;
                                  auVar66._4_4_ = uVar47 + 7;
                                  uVar47 = uVar47 + 4;
                                }
                                auVar66._4_4_ = uVar47 | 1;
                                while ((int)auVar66._4_4_ < (int)uVar19) {
                                  if (iVar29 == 0) {
                                    if (pauVar14 == (undefined1 (*) [32])0x0) {
                                      auVar56 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar65 = ZEXT1664(ZEXT816(0) << 0x40);
                                    }
                                    else {
                                      auVar56 = ZEXT3264(*pauVar14);
                                      auVar65 = ZEXT3264(*pauVar14);
                                    }
                                  }
                                  else {
                                    auVar65 = ZEXT3264(*pauVar46);
                                    auVar56 = ZEXT3264(pauVar46[1]);
                                  }
                                  auVar82 = auVar56._0_32_;
                                  auVar150 = auVar65._0_32_;
                                  if (0 < iVar28) {
                                    lVar30 = 0;
                                    uVar23 = uVar16;
                                    do {
                                      uVar18 = *(undefined4 *)(*pauVar15 + lVar30);
                                      auVar82._4_4_ = uVar18;
                                      auVar82._0_4_ = uVar18;
                                      auVar82._8_4_ = uVar18;
                                      auVar82._12_4_ = uVar18;
                                      auVar82._16_4_ = uVar18;
                                      auVar82._20_4_ = uVar18;
                                      auVar82._24_4_ = uVar18;
                                      auVar82._28_4_ = uVar18;
                                      uVar18 = *(undefined4 *)(*pauVar15 + lVar30 + 4);
                                      auVar86._4_4_ = uVar18;
                                      auVar86._0_4_ = uVar18;
                                      auVar86._8_4_ = uVar18;
                                      auVar86._12_4_ = uVar18;
                                      auVar86._16_4_ = uVar18;
                                      auVar86._20_4_ = uVar18;
                                      auVar86._24_4_ = uVar18;
                                      auVar86._28_4_ = uVar18;
                                      auVar50 = vfmadd231ps_fma(auVar65._0_32_,
                                                                *(undefined1 (*) [32])
                                                                 (*pauVar37 + lVar30 * 4),auVar82);
                                      auVar65 = ZEXT1664(auVar50);
                                      auVar150 = ZEXT1632(auVar50);
                                      auVar50 = vfmadd231ps_fma(auVar56._0_32_,
                                                                *(undefined1 (*) [32])
                                                                 (*pauVar37 + lVar30 * 4),auVar86);
                                      auVar56 = ZEXT1664(auVar50);
                                      auVar82 = ZEXT1632(auVar50);
                                      lVar30 = lVar30 + 8;
                                      auVar66._4_4_ = (int)uVar23 - 1;
                                      uVar23 = (ulong)auVar66._4_4_;
                                    } while (auVar66._4_4_ != 0);
                                    pauVar15 = (undefined1 (*) [16])(*pauVar15 + lVar30);
                                  }
                                  if (iVar17 < iVar35) {
                                    *pauVar46 = auVar150;
                                    pauVar46[1] = auVar82;
                                  }
                                  else {
                                    auVar66 = auVar150._16_16_;
                                    auVar50 = auVar82._0_16_;
                                    auVar58 = auVar150._0_16_;
                                    if (iVar48 == 1) {
                                      *(int *)*pauVar27 = auVar150._0_4_;
                                      uVar18 = vextractps_avx(auVar58,1);
                                      *(undefined4 *)(*pauVar27 + lVar42 * 4) = uVar18;
                                      uVar18 = vextractps_avx(auVar58,2);
                                      *(undefined4 *)(*pauVar27 + lVar10 * 4) = uVar18;
                                      uVar18 = vextractps_avx(auVar58,3);
                                      *(undefined4 *)(*pauVar27 + local_138 * 4) = uVar18;
                                      *(int *)(*pauVar27 + lVar38 * 4) = auVar150._16_4_;
                                      uVar18 = vextractps_avx(auVar66,1);
                                      *(undefined4 *)(*pauVar27 + local_b0 * 4) = uVar18;
                                      uVar18 = vextractps_avx(auVar66,2);
                                      *(undefined4 *)(*pauVar27 + local_b8 * 4) = uVar18;
                                      uVar18 = vextractps_avx(auVar66,3);
                                      *(undefined4 *)(*pauVar27 + local_c0 * 4) = uVar18;
                                      *(int *)(*pauVar27 + 4) = auVar82._0_4_;
                                      uVar18 = vextractps_avx(auVar50,1);
                                      *(undefined4 *)(*pauVar27 + local_130 * 4) = uVar18;
                                      uVar18 = vextractps_avx(auVar50,2);
                                      *(undefined4 *)(*pauVar27 + (long)local_c8 * 4) = uVar18;
                                      uVar18 = vextractps_avx(auVar50,3);
                                      *(undefined4 *)(*pauVar27 + (long)local_d0 * 4) = uVar18;
                                      auVar50 = auVar82._16_16_;
                                      *(int *)(*pauVar27 + local_68 * 4) = auVar82._16_4_;
                                      uVar18 = vextractps_avx(auVar50,1);
                                      *(undefined4 *)(*pauVar27 + local_70 * 4) = uVar18;
                                      uVar18 = vextractps_avx(auVar50,2);
                                      *(undefined4 *)(*pauVar27 + local_78 * 4) = uVar18;
                                      uVar18 = vextractps_avx(auVar50,3);
                                      *(undefined4 *)(*pauVar27 + local_80 * 4) = uVar18;
                                      pauVar27 = (undefined1 (*) [32])(*pauVar27 + 8);
                                    }
                                    else if (iVar48 == 4) {
                                      auVar73._16_16_ = auVar50;
                                      auVar73._0_16_ = auVar58;
                                      auVar82 = vperm2f128_avx(auVar150,auVar82,0x31);
                                      *pauVar27 = auVar73;
                                      *(undefined1 (*) [32])(*pauVar27 + lVar38 * 4) = auVar82;
                                      pauVar27 = pauVar27 + 1;
                                    }
                                    else if (iVar48 == 8) {
                                      *pauVar27 = auVar150;
                                      pauVar27[1] = auVar82;
                                      pauVar27 = pauVar27 + 2;
                                    }
                                  }
                                  pauVar46 = pauVar46 + 2;
                                  auVar66._4_4_ = uVar47 + 3;
                                  uVar47 = uVar47 + 2;
                                }
                                if ((int)uVar47 < (int)uVar19) {
                                  do {
                                    if (iVar29 == 0) {
                                      if (pauVar14 == (undefined1 (*) [32])0x0) {
                                        auVar56 = ZEXT1664(ZEXT816(0) << 0x40);
                                      }
                                      else {
                                        auVar56 = ZEXT3264(*pauVar14);
                                      }
                                    }
                                    else {
                                      auVar56 = ZEXT3264(*pauVar46);
                                    }
                                    auVar82 = auVar56._0_32_;
                                    if (0 < iVar28) {
                                      lVar30 = 0;
                                      uVar23 = uVar16;
                                      do {
                                        uVar18 = *(undefined4 *)(*pauVar15 + lVar30);
                                        auVar64._4_4_ = uVar18;
                                        auVar64._0_4_ = uVar18;
                                        auVar64._8_4_ = uVar18;
                                        auVar64._12_4_ = uVar18;
                                        auVar64._16_4_ = uVar18;
                                        auVar64._20_4_ = uVar18;
                                        auVar64._24_4_ = uVar18;
                                        auVar64._28_4_ = uVar18;
                                        auVar50 = vfmadd231ps_fma(auVar56._0_32_,auVar64,
                                                                  *(undefined1 (*) [32])
                                                                   (*pauVar37 + lVar30 * 8));
                                        auVar56 = ZEXT1664(auVar50);
                                        auVar82 = ZEXT1632(auVar50);
                                        lVar30 = lVar30 + 4;
                                        auVar66._4_4_ = (int)uVar23 - 1;
                                        uVar23 = (ulong)auVar66._4_4_;
                                      } while (auVar66._4_4_ != 0);
                                      pauVar15 = (undefined1 (*) [16])(*pauVar15 + lVar30);
                                    }
                                    if (iVar17 < iVar35) {
                                      *pauVar46 = auVar82;
                                    }
                                    else {
                                      auVar58 = auVar82._16_16_;
                                      auVar50 = auVar82._0_16_;
                                      if (iVar48 == 1) {
                                        *(int *)*pauVar27 = auVar82._0_4_;
                                        uVar18 = vextractps_avx(auVar50,1);
                                        *(undefined4 *)(*pauVar27 + lVar42 * 4) = uVar18;
                                        uVar18 = vextractps_avx(auVar50,2);
                                        *(undefined4 *)(*pauVar27 + lVar10 * 4) = uVar18;
                                        uVar18 = vextractps_avx(auVar50,3);
                                        *(undefined4 *)(*pauVar27 + lVar24 * 4) = uVar18;
                                        *(int *)(*pauVar27 + lVar38 * 4) = auVar82._16_4_;
                                        uVar18 = vextractps_avx(auVar58,1);
                                        *(undefined4 *)(*pauVar27 + lVar31 * 4) = uVar18;
                                        uVar18 = vextractps_avx(auVar58,2);
                                        *(undefined4 *)(*pauVar27 + local_1c8 * 4) = uVar18;
                                        uVar18 = vextractps_avx(auVar58,3);
                                        *(undefined4 *)(*pauVar27 + lVar41 * 4) = uVar18;
                                        pauVar27 = (undefined1 (*) [32])(*pauVar27 + 4);
                                      }
                                      else if (iVar48 == 4) {
                                        *(undefined1 (*) [16])*pauVar27 = auVar50;
                                        *(undefined1 (*) [16])(*pauVar27 + lVar38 * 4) = auVar58;
                                        pauVar27 = (undefined1 (*) [32])(*pauVar27 + 0x10);
                                      }
                                      else if (iVar48 == 8) {
                                        *pauVar27 = auVar82;
                                        pauVar27 = pauVar27 + 1;
                                      }
                                    }
                                    pauVar46 = pauVar46 + 1;
                                    uVar47 = uVar47 + 1;
                                  } while (uVar47 != uVar19);
                                }
                                pauVar37 = (undefined1 (*) [32])(*pauVar37 + local_48);
                                uVar23 = local_38 + 8;
                                pauVar27 = pauVar14;
                                local_88 = uVar36;
                              } while (local_38 + 0xf < (ulong)uVar44);
                            }
                            if ((int)((uint)uVar23 | 3) < (int)uVar44) {
                              local_130 = (long)(iVar48 * iVar45);
                              lVar10 = (long)iVar22;
                              lVar24 = (long)(iVar22 * 2);
                              lVar31 = (long)(local_90 * 0x300000000) >> 0x20;
                              local_138 = (long)(iVar28 * 4) * 4;
                              uVar23 = uVar23 & 0xffffffff;
                              pauVar27 = pauVar14;
                              do {
                                local_1c8 = uVar23;
                                pauVar14 = (undefined1 (*) [32])
                                           ((long)(this->super_Convolution).bias_data.data +
                                           local_1c8 * 4 + local_190 * 4);
                                if (pauVar27 == (undefined1 (*) [32])0x0) {
                                  pauVar14 = pauVar27;
                                }
                                uVar47 = 0;
                                pauVar15 = (undefined1 (*) [16])
                                           ((long)local_1d0->data +
                                           local_130 * 4 + (local_1c8 + local_190) * lVar10 * 4);
                                pauVar39 = local_1d8;
                                if (0xb < (int)uVar19) {
                                  uVar25 = 0;
                                  do {
                                    if (iVar29 == 0) {
                                      if (pauVar14 == (undefined1 (*) [32])0x0) {
                                        auVar56 = ZEXT1664(ZEXT816(0) << 0x40);
                                        auVar65 = ZEXT1664(ZEXT816(0) << 0x40);
                                        auVar74 = ZEXT1664(ZEXT816(0) << 0x40);
                                        auVar83 = ZEXT1664(ZEXT816(0) << 0x40);
                                        auVar87 = ZEXT1664(ZEXT816(0) << 0x40);
                                        auVar97 = ZEXT1664(ZEXT816(0) << 0x40);
                                        auVar103 = ZEXT1664(ZEXT816(0) << 0x40);
                                        auVar105 = ZEXT1664(ZEXT816(0) << 0x40);
                                        auVar108 = ZEXT1664(ZEXT816(0) << 0x40);
                                        auVar128 = ZEXT1664(ZEXT816(0) << 0x40);
                                        auVar134 = ZEXT1664(ZEXT816(0) << 0x40);
                                        auVar138 = ZEXT1664(ZEXT816(0) << 0x40);
                                      }
                                      else {
                                        auVar50 = *(undefined1 (*) [16])*pauVar14;
                                        auVar56 = ZEXT1664(auVar50);
                                        auVar65 = ZEXT1664(auVar50);
                                        auVar74 = ZEXT1664(auVar50);
                                        auVar83 = ZEXT1664(auVar50);
                                        auVar87 = ZEXT1664(auVar50);
                                        auVar97 = ZEXT1664(auVar50);
                                        auVar103 = ZEXT1664(auVar50);
                                        auVar105 = ZEXT1664(auVar50);
                                        auVar108 = ZEXT1664(auVar50);
                                        auVar128 = ZEXT1664(auVar50);
                                        auVar134 = ZEXT1664(auVar50);
                                        auVar138 = ZEXT1664(auVar50);
                                      }
                                    }
                                    else {
                                      auVar138 = ZEXT1664(*(undefined1 (*) [16])*pauVar46);
                                      auVar134 = ZEXT1664(*(undefined1 (*) [16])(*pauVar46 + 0x10));
                                      auVar128 = ZEXT1664(*(undefined1 (*) [16])pauVar46[1]);
                                      auVar108 = ZEXT1664(*(undefined1 (*) [16])(pauVar46[1] + 0x10)
                                                         );
                                      auVar105 = ZEXT1664(*(undefined1 (*) [16])pauVar46[2]);
                                      auVar103 = ZEXT1664(*(undefined1 (*) [16])(pauVar46[2] + 0x10)
                                                         );
                                      auVar97 = ZEXT1664(*(undefined1 (*) [16])pauVar46[3]);
                                      auVar87 = ZEXT1664(*(undefined1 (*) [16])(pauVar46[3] + 0x10))
                                      ;
                                      auVar83 = ZEXT1664(*(undefined1 (*) [16])pauVar46[4]);
                                      auVar74 = ZEXT1664(*(undefined1 (*) [16])(pauVar46[4] + 0x10))
                                      ;
                                      auVar65 = ZEXT1664(*(undefined1 (*) [16])pauVar46[5]);
                                      auVar56 = ZEXT1664(*(undefined1 (*) [16])(pauVar46[5] + 0x10))
                                      ;
                                    }
                                    auVar109 = auVar56._0_16_;
                                    auVar145 = auVar65._0_16_;
                                    auVar144 = auVar74._0_16_;
                                    auVar143 = auVar83._0_16_;
                                    auVar142 = auVar87._0_16_;
                                    auVar139 = auVar97._0_16_;
                                    auVar106 = auVar103._0_16_;
                                    auVar84 = auVar105._0_16_;
                                    auVar57 = auVar108._0_16_;
                                    auVar66 = auVar128._0_16_;
                                    auVar58 = auVar134._0_16_;
                                    auVar50 = auVar138._0_16_;
                                    uVar36 = uVar16;
                                    pauVar27 = pauVar37;
                                    if (0 < iVar28) {
                                      do {
                                        auVar109 = *(undefined1 (*) [16])*pauVar27;
                                        uVar18 = *(undefined4 *)*pauVar39;
                                        auVar50._4_4_ = uVar18;
                                        auVar50._0_4_ = uVar18;
                                        auVar50._8_4_ = uVar18;
                                        auVar50._12_4_ = uVar18;
                                        auVar50 = vfmadd231ps_fma(auVar138._0_16_,auVar109,auVar50);
                                        auVar138 = ZEXT1664(auVar50);
                                        uVar18 = *(undefined4 *)(*pauVar39 + 4);
                                        auVar84._4_4_ = uVar18;
                                        auVar84._0_4_ = uVar18;
                                        auVar84._8_4_ = uVar18;
                                        auVar84._12_4_ = uVar18;
                                        auVar58 = vfmadd231ps_fma(auVar134._0_16_,auVar109,auVar84);
                                        auVar134 = ZEXT1664(auVar58);
                                        uVar18 = *(undefined4 *)(*pauVar39 + 8);
                                        auVar106._4_4_ = uVar18;
                                        auVar106._0_4_ = uVar18;
                                        auVar106._8_4_ = uVar18;
                                        auVar106._12_4_ = uVar18;
                                        auVar66 = vfmadd231ps_fma(auVar128._0_16_,auVar109,auVar106)
                                        ;
                                        auVar128 = ZEXT1664(auVar66);
                                        uVar18 = *(undefined4 *)(*pauVar39 + 0xc);
                                        auVar139._4_4_ = uVar18;
                                        auVar139._0_4_ = uVar18;
                                        auVar139._8_4_ = uVar18;
                                        auVar139._12_4_ = uVar18;
                                        auVar57 = vfmadd231ps_fma(auVar108._0_16_,auVar109,auVar139)
                                        ;
                                        auVar108 = ZEXT1664(auVar57);
                                        uVar18 = *(undefined4 *)pauVar39[1];
                                        auVar142._4_4_ = uVar18;
                                        auVar142._0_4_ = uVar18;
                                        auVar142._8_4_ = uVar18;
                                        auVar142._12_4_ = uVar18;
                                        auVar84 = vfmadd231ps_fma(auVar105._0_16_,auVar109,auVar142)
                                        ;
                                        auVar105 = ZEXT1664(auVar84);
                                        uVar18 = *(undefined4 *)(pauVar39[1] + 4);
                                        auVar143._4_4_ = uVar18;
                                        auVar143._0_4_ = uVar18;
                                        auVar143._8_4_ = uVar18;
                                        auVar143._12_4_ = uVar18;
                                        auVar106 = vfmadd231ps_fma(auVar103._0_16_,auVar109,auVar143
                                                                  );
                                        auVar103 = ZEXT1664(auVar106);
                                        uVar18 = *(undefined4 *)(pauVar39[1] + 8);
                                        auVar144._4_4_ = uVar18;
                                        auVar144._0_4_ = uVar18;
                                        auVar144._8_4_ = uVar18;
                                        auVar144._12_4_ = uVar18;
                                        auVar139 = vfmadd231ps_fma(auVar97._0_16_,auVar109,auVar144)
                                        ;
                                        auVar97 = ZEXT1664(auVar139);
                                        uVar18 = *(undefined4 *)(pauVar39[1] + 0xc);
                                        auVar145._4_4_ = uVar18;
                                        auVar145._0_4_ = uVar18;
                                        auVar145._8_4_ = uVar18;
                                        auVar145._12_4_ = uVar18;
                                        auVar142 = vfmadd231ps_fma(auVar87._0_16_,auVar109,auVar145)
                                        ;
                                        auVar87 = ZEXT1664(auVar142);
                                        uVar18 = *(undefined4 *)pauVar39[2];
                                        auVar146._4_4_ = uVar18;
                                        auVar146._0_4_ = uVar18;
                                        auVar146._8_4_ = uVar18;
                                        auVar146._12_4_ = uVar18;
                                        auVar143 = vfmadd231ps_fma(auVar83._0_16_,auVar109,auVar146)
                                        ;
                                        auVar83 = ZEXT1664(auVar143);
                                        uVar18 = *(undefined4 *)(pauVar39[2] + 4);
                                        auVar147._4_4_ = uVar18;
                                        auVar147._0_4_ = uVar18;
                                        auVar147._8_4_ = uVar18;
                                        auVar147._12_4_ = uVar18;
                                        auVar144 = vfmadd231ps_fma(auVar74._0_16_,auVar109,auVar147)
                                        ;
                                        auVar74 = ZEXT1664(auVar144);
                                        uVar18 = *(undefined4 *)(pauVar39[2] + 8);
                                        auVar148._4_4_ = uVar18;
                                        auVar148._0_4_ = uVar18;
                                        auVar148._8_4_ = uVar18;
                                        auVar148._12_4_ = uVar18;
                                        auVar145 = vfmadd231ps_fma(auVar65._0_16_,auVar109,auVar148)
                                        ;
                                        auVar65 = ZEXT1664(auVar145);
                                        uVar18 = *(undefined4 *)(pauVar39[2] + 0xc);
                                        auVar149._4_4_ = uVar18;
                                        auVar149._0_4_ = uVar18;
                                        auVar149._8_4_ = uVar18;
                                        auVar149._12_4_ = uVar18;
                                        auVar109 = vfmadd231ps_fma(auVar56._0_16_,auVar109,auVar149)
                                        ;
                                        auVar56 = ZEXT1664(auVar109);
                                        pauVar39 = pauVar39 + 3;
                                        uVar47 = (int)uVar36 - 1;
                                        uVar36 = (ulong)uVar47;
                                        pauVar27 = (undefined1 (*) [32])(*pauVar27 + 0x10);
                                      } while (uVar47 != 0);
                                    }
                                    if (iVar17 < iVar35) {
                                      *(undefined1 (*) [16])*pauVar46 = auVar50;
                                      *(undefined1 (*) [16])(*pauVar46 + 0x10) = auVar58;
                                      *(undefined1 (*) [16])pauVar46[1] = auVar66;
                                      *(undefined1 (*) [16])(pauVar46[1] + 0x10) = auVar57;
                                      *(undefined1 (*) [16])pauVar46[2] = auVar84;
                                      *(undefined1 (*) [16])(pauVar46[2] + 0x10) = auVar106;
                                      *(undefined1 (*) [16])pauVar46[3] = auVar139;
                                      *(undefined1 (*) [16])(pauVar46[3] + 0x10) = auVar142;
                                      *(undefined1 (*) [16])pauVar46[4] = auVar143;
                                      *(undefined1 (*) [16])(pauVar46[4] + 0x10) = auVar144;
                                      *(undefined1 (*) [16])pauVar46[5] = auVar145;
                                      *(undefined1 (*) [16])(pauVar46[5] + 0x10) = auVar109;
                                    }
                                    else if (iVar48 == 1) {
                                      auVar146 = vunpcklps_avx(auVar50,auVar58);
                                      auVar148 = vunpcklps_avx(auVar66,auVar57);
                                      auVar147 = vunpckhps_avx(auVar50,auVar58);
                                      auVar66 = vunpckhps_avx(auVar66,auVar57);
                                      auVar50 = vmovlhps_avx(auVar146,auVar148);
                                      auVar146 = vunpckhpd_avx(auVar146,auVar148);
                                      auVar58 = vmovlhps_avx(auVar147,auVar66);
                                      auVar147 = vunpckhpd_avx(auVar147,auVar66);
                                      auVar57 = vunpcklps_avx(auVar84,auVar106);
                                      auVar148 = vunpcklps_avx(auVar139,auVar142);
                                      auVar84 = vunpckhps_avx(auVar84,auVar106);
                                      auVar106 = vunpckhps_avx(auVar139,auVar142);
                                      auVar66 = vmovlhps_avx(auVar57,auVar148);
                                      auVar139 = vunpckhpd_avx(auVar57,auVar148);
                                      auVar57 = vmovlhps_avx(auVar84,auVar106);
                                      auVar142 = vunpckhpd_avx(auVar84,auVar106);
                                      auVar106 = vunpcklps_avx(auVar143,auVar144);
                                      auVar148 = vunpcklps_avx(auVar145,auVar109);
                                      auVar144 = vunpckhps_avx(auVar143,auVar144);
                                      auVar145 = vunpckhps_avx(auVar145,auVar109);
                                      auVar84 = vmovlhps_avx(auVar106,auVar148);
                                      auVar143 = vunpckhpd_avx(auVar106,auVar148);
                                      auVar106 = vmovlhps_avx(auVar144,auVar145);
                                      auVar144 = vunpckhpd_avx(auVar144,auVar145);
                                      *pauVar15 = auVar50;
                                      *(undefined1 (*) [16])(*pauVar15 + lVar10 * 4) = auVar146;
                                      *(undefined1 (*) [16])(*pauVar15 + lVar24 * 4) = auVar58;
                                      *(undefined1 (*) [16])(*pauVar15 + lVar31 * 4) = auVar147;
                                      pauVar15[1] = auVar66;
                                      *(undefined1 (*) [16])(pauVar15[1] + lVar10 * 4) = auVar139;
                                      *(undefined1 (*) [16])(pauVar15[1] + lVar24 * 4) = auVar57;
                                      *(undefined1 (*) [16])(pauVar15[1] + lVar31 * 4) = auVar142;
                                      pauVar15[2] = auVar84;
                                      *(undefined1 (*) [16])(pauVar15[2] + lVar10 * 4) = auVar143;
                                      *(undefined1 (*) [16])(pauVar15[2] + lVar24 * 4) = auVar106;
                                      *(undefined1 (*) [16])(pauVar15[2] + lVar31 * 4) = auVar144;
                                      pauVar15 = pauVar15 + 3;
                                    }
                                    else if (iVar48 == 4) {
                                      *pauVar15 = auVar50;
                                      pauVar15[1] = auVar58;
                                      pauVar15[2] = auVar66;
                                      pauVar15[3] = auVar57;
                                      pauVar15[4] = auVar84;
                                      pauVar15[5] = auVar106;
                                      pauVar15[6] = auVar139;
                                      pauVar15[7] = auVar142;
                                      pauVar15[8] = auVar143;
                                      pauVar15[9] = auVar144;
                                      pauVar15[10] = auVar145;
                                      pauVar15[0xb] = auVar109;
                                      pauVar15 = pauVar15 + 0xc;
                                    }
                                    pauVar46 = pauVar46 + 6;
                                    uVar47 = uVar25 + 0xc;
                                    iVar8 = uVar25 + 0x17;
                                    uVar25 = uVar47;
                                  } while (iVar8 < (int)uVar19);
                                }
                                iVar8 = uVar47 + 7;
                                while (iVar8 < (int)uVar19) {
                                  if (iVar29 == 0) {
                                    if (pauVar14 == (undefined1 (*) [32])0x0) {
                                      auVar56 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar65 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar74 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar83 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar87 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar97 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar103 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar105 = ZEXT1664(ZEXT816(0) << 0x40);
                                    }
                                    else {
                                      auVar50 = *(undefined1 (*) [16])*pauVar14;
                                      auVar56 = ZEXT1664(auVar50);
                                      auVar65 = ZEXT1664(auVar50);
                                      auVar74 = ZEXT1664(auVar50);
                                      auVar83 = ZEXT1664(auVar50);
                                      auVar87 = ZEXT1664(auVar50);
                                      auVar97 = ZEXT1664(auVar50);
                                      auVar103 = ZEXT1664(auVar50);
                                      auVar105 = ZEXT1664(auVar50);
                                    }
                                  }
                                  else {
                                    auVar105 = ZEXT1664(*(undefined1 (*) [16])*pauVar46);
                                    auVar103 = ZEXT1664(*(undefined1 (*) [16])(*pauVar46 + 0x10));
                                    auVar97 = ZEXT1664(*(undefined1 (*) [16])pauVar46[1]);
                                    auVar87 = ZEXT1664(*(undefined1 (*) [16])(pauVar46[1] + 0x10));
                                    auVar56 = ZEXT1664(*(undefined1 (*) [16])pauVar46[2]);
                                    auVar65 = ZEXT1664(*(undefined1 (*) [16])(pauVar46[2] + 0x10));
                                    auVar74 = ZEXT1664(*(undefined1 (*) [16])pauVar46[3]);
                                    auVar83 = ZEXT1664(*(undefined1 (*) [16])(pauVar46[3] + 0x10));
                                  }
                                  auVar142 = auVar83._0_16_;
                                  auVar139 = auVar74._0_16_;
                                  auVar106 = auVar65._0_16_;
                                  auVar84 = auVar56._0_16_;
                                  auVar57 = auVar87._0_16_;
                                  auVar66 = auVar97._0_16_;
                                  auVar58 = auVar103._0_16_;
                                  auVar50 = auVar105._0_16_;
                                  uVar36 = uVar16;
                                  pauVar27 = pauVar37;
                                  if (0 < iVar28) {
                                    do {
                                      auVar142 = *(undefined1 (*) [16])*pauVar27;
                                      uVar18 = *(undefined4 *)*pauVar39;
                                      auVar109._4_4_ = uVar18;
                                      auVar109._0_4_ = uVar18;
                                      auVar109._8_4_ = uVar18;
                                      auVar109._12_4_ = uVar18;
                                      auVar50 = vfmadd231ps_fma(auVar105._0_16_,auVar142,auVar109);
                                      auVar105 = ZEXT1664(auVar50);
                                      uVar18 = *(undefined4 *)(*pauVar39 + 4);
                                      auVar110._4_4_ = uVar18;
                                      auVar110._0_4_ = uVar18;
                                      auVar110._8_4_ = uVar18;
                                      auVar110._12_4_ = uVar18;
                                      auVar58 = vfmadd231ps_fma(auVar103._0_16_,auVar142,auVar110);
                                      auVar103 = ZEXT1664(auVar58);
                                      uVar18 = *(undefined4 *)(*pauVar39 + 8);
                                      auVar111._4_4_ = uVar18;
                                      auVar111._0_4_ = uVar18;
                                      auVar111._8_4_ = uVar18;
                                      auVar111._12_4_ = uVar18;
                                      auVar66 = vfmadd231ps_fma(auVar97._0_16_,auVar142,auVar111);
                                      auVar97 = ZEXT1664(auVar66);
                                      uVar18 = *(undefined4 *)(*pauVar39 + 0xc);
                                      auVar112._4_4_ = uVar18;
                                      auVar112._0_4_ = uVar18;
                                      auVar112._8_4_ = uVar18;
                                      auVar112._12_4_ = uVar18;
                                      auVar57 = vfmadd231ps_fma(auVar87._0_16_,auVar142,auVar112);
                                      auVar87 = ZEXT1664(auVar57);
                                      uVar18 = *(undefined4 *)pauVar39[1];
                                      auVar113._4_4_ = uVar18;
                                      auVar113._0_4_ = uVar18;
                                      auVar113._8_4_ = uVar18;
                                      auVar113._12_4_ = uVar18;
                                      auVar84 = vfmadd231ps_fma(auVar56._0_16_,auVar142,auVar113);
                                      auVar56 = ZEXT1664(auVar84);
                                      uVar18 = *(undefined4 *)(pauVar39[1] + 4);
                                      auVar114._4_4_ = uVar18;
                                      auVar114._0_4_ = uVar18;
                                      auVar114._8_4_ = uVar18;
                                      auVar114._12_4_ = uVar18;
                                      auVar106 = vfmadd231ps_fma(auVar65._0_16_,auVar142,auVar114);
                                      auVar65 = ZEXT1664(auVar106);
                                      uVar18 = *(undefined4 *)(pauVar39[1] + 8);
                                      auVar115._4_4_ = uVar18;
                                      auVar115._0_4_ = uVar18;
                                      auVar115._8_4_ = uVar18;
                                      auVar115._12_4_ = uVar18;
                                      auVar139 = vfmadd231ps_fma(auVar74._0_16_,auVar142,auVar115);
                                      auVar74 = ZEXT1664(auVar139);
                                      uVar18 = *(undefined4 *)(pauVar39[1] + 0xc);
                                      auVar116._4_4_ = uVar18;
                                      auVar116._0_4_ = uVar18;
                                      auVar116._8_4_ = uVar18;
                                      auVar116._12_4_ = uVar18;
                                      auVar142 = vfmadd231ps_fma(auVar83._0_16_,auVar142,auVar116);
                                      auVar83 = ZEXT1664(auVar142);
                                      pauVar39 = pauVar39 + 2;
                                      uVar25 = (int)uVar36 - 1;
                                      uVar36 = (ulong)uVar25;
                                      pauVar27 = (undefined1 (*) [32])(*pauVar27 + 0x10);
                                    } while (uVar25 != 0);
                                  }
                                  if (iVar17 < iVar35) {
                                    *(undefined1 (*) [16])*pauVar46 = auVar50;
                                    *(undefined1 (*) [16])(*pauVar46 + 0x10) = auVar58;
                                    *(undefined1 (*) [16])pauVar46[1] = auVar66;
                                    *(undefined1 (*) [16])(pauVar46[1] + 0x10) = auVar57;
                                    *(undefined1 (*) [16])pauVar46[2] = auVar84;
                                    *(undefined1 (*) [16])(pauVar46[2] + 0x10) = auVar106;
                                    *(undefined1 (*) [16])pauVar46[3] = auVar139;
                                    *(undefined1 (*) [16])(pauVar46[3] + 0x10) = auVar142;
                                  }
                                  else if (iVar48 == 1) {
                                    auVar143 = vunpcklps_avx(auVar50,auVar58);
                                    auVar145 = vunpcklps_avx(auVar66,auVar57);
                                    auVar144 = vunpckhps_avx(auVar50,auVar58);
                                    auVar66 = vunpckhps_avx(auVar66,auVar57);
                                    auVar50 = vmovlhps_avx(auVar143,auVar145);
                                    auVar143 = vunpckhpd_avx(auVar143,auVar145);
                                    auVar58 = vmovlhps_avx(auVar144,auVar66);
                                    auVar144 = vunpckhpd_avx(auVar144,auVar66);
                                    auVar57 = vunpcklps_avx(auVar84,auVar106);
                                    auVar145 = vunpcklps_avx(auVar139,auVar142);
                                    auVar106 = vunpckhps_avx(auVar84,auVar106);
                                    auVar139 = vunpckhps_avx(auVar139,auVar142);
                                    auVar66 = vmovlhps_avx(auVar57,auVar145);
                                    auVar84 = vunpckhpd_avx(auVar57,auVar145);
                                    auVar57 = vmovlhps_avx(auVar106,auVar139);
                                    auVar106 = vunpckhpd_avx(auVar106,auVar139);
                                    *pauVar15 = auVar50;
                                    *(undefined1 (*) [16])(*pauVar15 + lVar10 * 4) = auVar143;
                                    *(undefined1 (*) [16])(*pauVar15 + lVar24 * 4) = auVar58;
                                    *(undefined1 (*) [16])(*pauVar15 + lVar31 * 4) = auVar144;
                                    pauVar15[1] = auVar66;
                                    *(undefined1 (*) [16])(pauVar15[1] + lVar10 * 4) = auVar84;
                                    *(undefined1 (*) [16])(pauVar15[1] + lVar24 * 4) = auVar57;
                                    *(undefined1 (*) [16])(pauVar15[1] + lVar31 * 4) = auVar106;
                                    pauVar15 = pauVar15 + 2;
                                  }
                                  else if (iVar48 == 4) {
                                    *pauVar15 = auVar50;
                                    pauVar15[1] = auVar58;
                                    pauVar15[2] = auVar66;
                                    pauVar15[3] = auVar57;
                                    pauVar15[4] = auVar84;
                                    pauVar15[5] = auVar106;
                                    pauVar15[6] = auVar139;
                                    pauVar15[7] = auVar142;
                                    pauVar15 = pauVar15 + 8;
                                  }
                                  pauVar46 = pauVar46 + 4;
                                  iVar8 = uVar47 + 0xf;
                                  uVar47 = uVar47 + 8;
                                }
                                auVar66._4_4_ = uVar47 | 3;
                                while ((int)auVar66._4_4_ < (int)uVar19) {
                                  if (iVar29 == 0) {
                                    if (pauVar14 == (undefined1 (*) [32])0x0) {
                                      auVar56 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar65 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar74 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar83 = ZEXT1664(ZEXT816(0) << 0x40);
                                    }
                                    else {
                                      auVar50 = *(undefined1 (*) [16])*pauVar14;
                                      auVar56 = ZEXT1664(auVar50);
                                      auVar65 = ZEXT1664(auVar50);
                                      auVar74 = ZEXT1664(auVar50);
                                      auVar83 = ZEXT1664(auVar50);
                                    }
                                  }
                                  else {
                                    auVar56 = ZEXT1664(*(undefined1 (*) [16])*pauVar46);
                                    auVar65 = ZEXT1664(*(undefined1 (*) [16])(*pauVar46 + 0x10));
                                    auVar74 = ZEXT1664(*(undefined1 (*) [16])pauVar46[1]);
                                    auVar83 = ZEXT1664(*(undefined1 (*) [16])(pauVar46[1] + 0x10));
                                  }
                                  auVar57 = auVar83._0_16_;
                                  auVar66 = auVar74._0_16_;
                                  auVar58 = auVar65._0_16_;
                                  auVar50 = auVar56._0_16_;
                                  if (0 < iVar28) {
                                    lVar38 = 0;
                                    uVar36 = uVar16;
                                    do {
                                      lVar42 = lVar38;
                                      auVar57 = *(undefined1 (*) [16])(*pauVar37 + lVar42);
                                      uVar18 = *(undefined4 *)(*pauVar39 + lVar42);
                                      auVar88._4_4_ = uVar18;
                                      auVar88._0_4_ = uVar18;
                                      auVar88._8_4_ = uVar18;
                                      auVar88._12_4_ = uVar18;
                                      auVar50 = vfmadd231ps_fma(auVar56._0_16_,auVar57,auVar88);
                                      auVar56 = ZEXT1664(auVar50);
                                      uVar18 = *(undefined4 *)(*pauVar39 + lVar42 + 4);
                                      auVar89._4_4_ = uVar18;
                                      auVar89._0_4_ = uVar18;
                                      auVar89._8_4_ = uVar18;
                                      auVar89._12_4_ = uVar18;
                                      auVar58 = vfmadd231ps_fma(auVar65._0_16_,auVar57,auVar89);
                                      auVar65 = ZEXT1664(auVar58);
                                      uVar18 = *(undefined4 *)(*pauVar39 + lVar42 + 8);
                                      auVar90._4_4_ = uVar18;
                                      auVar90._0_4_ = uVar18;
                                      auVar90._8_4_ = uVar18;
                                      auVar90._12_4_ = uVar18;
                                      auVar66 = vfmadd231ps_fma(auVar74._0_16_,auVar57,auVar90);
                                      auVar74 = ZEXT1664(auVar66);
                                      uVar18 = *(undefined4 *)(*pauVar39 + lVar42 + 0xc);
                                      auVar91._4_4_ = uVar18;
                                      auVar91._0_4_ = uVar18;
                                      auVar91._8_4_ = uVar18;
                                      auVar91._12_4_ = uVar18;
                                      auVar57 = vfmadd231ps_fma(auVar83._0_16_,auVar57,auVar91);
                                      auVar83 = ZEXT1664(auVar57);
                                      uVar25 = (int)uVar36 - 1;
                                      uVar36 = (ulong)uVar25;
                                      lVar38 = lVar42 + 0x10;
                                    } while (uVar25 != 0);
                                    pauVar39 = (undefined1 (*) [16])(pauVar39[1] + lVar42);
                                  }
                                  if (iVar17 < iVar35) {
                                    *(undefined1 (*) [16])*pauVar46 = auVar50;
                                    *(undefined1 (*) [16])(*pauVar46 + 0x10) = auVar58;
                                    *(undefined1 (*) [16])pauVar46[1] = auVar66;
                                    *(undefined1 (*) [16])(pauVar46[1] + 0x10) = auVar57;
                                  }
                                  else if (iVar48 == 1) {
                                    auVar106 = vunpcklps_avx(auVar50,auVar58);
                                    auVar139 = vunpcklps_avx(auVar66,auVar57);
                                    auVar84 = vunpckhps_avx(auVar50,auVar58);
                                    auVar57 = vunpckhps_avx(auVar66,auVar57);
                                    auVar50 = vmovlhps_avx(auVar106,auVar139);
                                    auVar66 = vunpckhpd_avx(auVar106,auVar139);
                                    auVar58 = vmovlhps_avx(auVar84,auVar57);
                                    auVar57 = vunpckhpd_avx(auVar84,auVar57);
                                    *pauVar15 = auVar50;
                                    *(undefined1 (*) [16])(*pauVar15 + lVar10 * 4) = auVar66;
                                    *(undefined1 (*) [16])(*pauVar15 + lVar24 * 4) = auVar58;
                                    *(undefined1 (*) [16])(*pauVar15 + lVar31 * 4) = auVar57;
                                    pauVar15 = pauVar15 + 1;
                                  }
                                  else if (iVar48 == 4) {
                                    *pauVar15 = auVar50;
                                    pauVar15[1] = auVar58;
                                    pauVar15[2] = auVar66;
                                    pauVar15[3] = auVar57;
                                    pauVar15 = pauVar15 + 4;
                                  }
                                  pauVar46 = pauVar46 + 2;
                                  auVar66._4_4_ = uVar47 + 7;
                                  uVar47 = uVar47 + 4;
                                }
                                auVar66._4_4_ = uVar47 | 1;
                                while ((int)auVar66._4_4_ < (int)uVar19) {
                                  if (iVar29 == 0) {
                                    if (pauVar14 == (undefined1 (*) [32])0x0) {
                                      auVar65 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar56 = ZEXT1664(ZEXT816(0) << 0x40);
                                    }
                                    else {
                                      auVar65 = ZEXT1664(*(undefined1 (*) [16])*pauVar14);
                                      auVar56 = ZEXT1664(*(undefined1 (*) [16])*pauVar14);
                                    }
                                  }
                                  else {
                                    auVar65 = ZEXT1664(*(undefined1 (*) [16])*pauVar46);
                                    auVar56 = ZEXT1664(*(undefined1 (*) [16])(*pauVar46 + 0x10));
                                  }
                                  auVar58 = auVar56._0_16_;
                                  auVar50 = auVar65._0_16_;
                                  if (0 < iVar28) {
                                    lVar38 = 0;
                                    uVar36 = uVar16;
                                    do {
                                      uVar18 = *(undefined4 *)(*pauVar39 + lVar38);
                                      auVar75._4_4_ = uVar18;
                                      auVar75._0_4_ = uVar18;
                                      auVar75._8_4_ = uVar18;
                                      auVar75._12_4_ = uVar18;
                                      auVar50 = vfmadd231ps_fma(auVar65._0_16_,
                                                                *(undefined1 (*) [16])
                                                                 (*pauVar37 + lVar38 * 2),auVar75);
                                      auVar65 = ZEXT1664(auVar50);
                                      uVar18 = *(undefined4 *)(*pauVar39 + lVar38 + 4);
                                      auVar76._4_4_ = uVar18;
                                      auVar76._0_4_ = uVar18;
                                      auVar76._8_4_ = uVar18;
                                      auVar76._12_4_ = uVar18;
                                      auVar58 = vfmadd231ps_fma(auVar56._0_16_,
                                                                *(undefined1 (*) [16])
                                                                 (*pauVar37 + lVar38 * 2),auVar76);
                                      auVar56 = ZEXT1664(auVar58);
                                      lVar38 = lVar38 + 8;
                                      auVar66._4_4_ = (int)uVar36 - 1;
                                      uVar36 = (ulong)auVar66._4_4_;
                                    } while (auVar66._4_4_ != 0);
                                    pauVar39 = (undefined1 (*) [16])(*pauVar39 + lVar38);
                                  }
                                  if (iVar17 < iVar35) {
                                    *(undefined1 (*) [16])*pauVar46 = auVar50;
                                    *(undefined1 (*) [16])(*pauVar46 + 0x10) = auVar58;
                                  }
                                  else if (iVar48 == 1) {
                                    *(int *)*pauVar15 = auVar50._0_4_;
                                    uVar18 = vextractps_avx(auVar50,1);
                                    *(undefined4 *)(*pauVar15 + lVar10 * 4) = uVar18;
                                    uVar18 = vextractps_avx(auVar50,2);
                                    *(undefined4 *)(*pauVar15 + lVar24 * 4) = uVar18;
                                    uVar18 = vextractps_avx(auVar50,3);
                                    *(undefined4 *)(*pauVar15 + (long)(iVar22 * 3) * 4) = uVar18;
                                    *(int *)(*pauVar15 + 4) = auVar58._0_4_;
                                    uVar18 = vextractps_avx(auVar58,1);
                                    *(undefined4 *)
                                     (*pauVar15 +
                                     ((long)((local_90 << 0x20) + 0x100000000) >> 0x20) * 4) =
                                         uVar18;
                                    uVar18 = vextractps_avx(auVar58,2);
                                    *(undefined4 *)(*pauVar15 + (long)(iVar22 * 2 + 1) * 4) = uVar18
                                    ;
                                    uVar18 = vextractps_avx(auVar58,3);
                                    *(undefined4 *)(*pauVar15 + (long)(iVar22 * 3 + 1) * 4) = uVar18
                                    ;
                                    pauVar15 = (undefined1 (*) [16])(*pauVar15 + 8);
                                  }
                                  else if (iVar48 == 4) {
                                    *pauVar15 = auVar50;
                                    pauVar15[1] = auVar58;
                                    pauVar15 = pauVar15 + 2;
                                  }
                                  pauVar46 = pauVar46 + 1;
                                  auVar66._4_4_ = uVar47 + 3;
                                  uVar47 = uVar47 + 2;
                                }
                                if ((int)uVar47 < (int)uVar19) {
                                  do {
                                    if (iVar29 == 0) {
                                      if (pauVar14 == (undefined1 (*) [32])0x0) {
                                        auVar56 = ZEXT1664(ZEXT816(0) << 0x40);
                                      }
                                      else {
                                        auVar56 = ZEXT1664(*(undefined1 (*) [16])*pauVar14);
                                      }
                                    }
                                    else {
                                      auVar56 = ZEXT1664(*(undefined1 (*) [16])*pauVar46);
                                    }
                                    auVar50 = auVar56._0_16_;
                                    if (0 < iVar28) {
                                      lVar38 = 0;
                                      uVar36 = uVar16;
                                      do {
                                        uVar18 = *(undefined4 *)(*pauVar39 + lVar38);
                                        auVar59._4_4_ = uVar18;
                                        auVar59._0_4_ = uVar18;
                                        auVar59._8_4_ = uVar18;
                                        auVar59._12_4_ = uVar18;
                                        auVar50 = vfmadd231ps_fma(auVar56._0_16_,auVar59,
                                                                  *(undefined1 (*) [16])
                                                                   (*pauVar37 + lVar38 * 4));
                                        auVar56 = ZEXT1664(auVar50);
                                        lVar38 = lVar38 + 4;
                                        auVar66._4_4_ = (int)uVar36 - 1;
                                        uVar36 = (ulong)auVar66._4_4_;
                                      } while (auVar66._4_4_ != 0);
                                      pauVar39 = (undefined1 (*) [16])(*pauVar39 + lVar38);
                                    }
                                    if (iVar17 < iVar35) {
                                      *(undefined1 (*) [16])*pauVar46 = auVar50;
                                    }
                                    else if (iVar48 == 1) {
                                      *(int *)*pauVar15 = auVar50._0_4_;
                                      uVar18 = vextractps_avx(auVar50,1);
                                      *(undefined4 *)(*pauVar15 + lVar10 * 4) = uVar18;
                                      uVar18 = vextractps_avx(auVar50,2);
                                      *(undefined4 *)(*pauVar15 + lVar24 * 4) = uVar18;
                                      uVar18 = vextractps_avx(auVar50,3);
                                      *(undefined4 *)(*pauVar15 + lVar31 * 4) = uVar18;
                                      pauVar15 = (undefined1 (*) [16])(*pauVar15 + 4);
                                    }
                                    else if (iVar48 == 4) {
                                      *pauVar15 = auVar50;
                                      pauVar15 = pauVar15 + 1;
                                    }
                                    pauVar46 = (undefined1 (*) [32])(*pauVar46 + 0x10);
                                    uVar47 = uVar47 + 1;
                                  } while (uVar47 != uVar19);
                                }
                                pauVar37 = (undefined1 (*) [32])(*pauVar37 + local_138);
                                uVar23 = local_1c8 + 4;
                                pauVar27 = pauVar14;
                              } while ((long)(local_1c8 + 7) < local_128);
                            }
                            if ((int)((uint)uVar23 | 1) < (int)uVar44) {
                              lVar31 = (long)iVar22;
                              uVar47 = local_5c;
                              if ((int)uVar9 < (int)local_5c) {
                                uVar47 = uVar9;
                              }
                              uVar36 = uVar23 & 0xffffffff;
                              do {
                                pauVar27 = (undefined1 (*) [32])
                                           ((long)(this->super_Convolution).bias_data.data +
                                           uVar36 * 4 + local_190 * 4);
                                if (pauVar14 != (undefined1 (*) [32])0x0) {
                                  pauVar14 = pauVar27;
                                }
                                uVar9 = 0;
                                pauVar15 = (undefined1 (*) [16])
                                           ((long)local_1d0->data +
                                           local_58 * 4 + (uVar36 + local_190) * lVar31 * 4);
                                pauVar39 = local_1d8;
                                if (0xb < (int)uVar19) {
                                  uVar25 = 0;
                                  do {
                                    if (iVar29 == 0) {
                                      if (pauVar14 == (undefined1 (*) [32])0x0) {
                                        auVar56 = ZEXT1664(ZEXT816(0) << 0x40);
                                        auVar65 = ZEXT1664(ZEXT816(0) << 0x40);
                                        auVar74 = ZEXT1664(ZEXT816(0) << 0x40);
                                        auVar83 = ZEXT1664(ZEXT816(0) << 0x40);
                                        auVar87 = ZEXT1664(ZEXT816(0) << 0x40);
                                        auVar97 = ZEXT1664(ZEXT816(0) << 0x40);
                                      }
                                      else {
                                        uVar18 = *(undefined4 *)*pauVar14;
                                        auVar51._4_4_ = uVar18;
                                        auVar51._0_4_ = uVar18;
                                        auVar51._8_4_ = uVar18;
                                        auVar51._12_4_ = uVar18;
                                        auVar56 = ZEXT1664(auVar51);
                                        uVar18 = *(undefined4 *)(*pauVar14 + 4);
                                        auVar77._4_4_ = uVar18;
                                        auVar77._0_4_ = uVar18;
                                        auVar77._8_4_ = uVar18;
                                        auVar77._12_4_ = uVar18;
                                        auVar83 = ZEXT1664(auVar77);
                                        auVar65 = ZEXT1664(auVar51);
                                        auVar74 = ZEXT1664(auVar51);
                                        auVar87 = ZEXT1664(auVar77);
                                        auVar97 = ZEXT1664(auVar77);
                                      }
                                    }
                                    else {
                                      auVar50 = vshufps_avx(*(undefined1 (*) [16])*pauVar46,
                                                            *(undefined1 (*) [16])(*pauVar46 + 0x10)
                                                            ,0x88);
                                      auVar56 = ZEXT1664(auVar50);
                                      auVar50 = vshufps_avx(*(undefined1 (*) [16])pauVar46[1],
                                                            *(undefined1 (*) [16])
                                                             (pauVar46[1] + 0x10),0x88);
                                      auVar65 = ZEXT1664(auVar50);
                                      auVar50 = vshufps_avx(*(undefined1 (*) [16])pauVar46[2],
                                                            *(undefined1 (*) [16])
                                                             (pauVar46[2] + 0x10),0x88);
                                      auVar74 = ZEXT1664(auVar50);
                                      auVar50 = vshufps_avx(*(undefined1 (*) [16])*pauVar46,
                                                            *(undefined1 (*) [16])(*pauVar46 + 0x10)
                                                            ,0xdd);
                                      auVar83 = ZEXT1664(auVar50);
                                      auVar50 = vshufps_avx(*(undefined1 (*) [16])pauVar46[1],
                                                            *(undefined1 (*) [16])
                                                             (pauVar46[1] + 0x10),0xdd);
                                      auVar87 = ZEXT1664(auVar50);
                                      auVar50 = vshufps_avx(*(undefined1 (*) [16])pauVar46[2],
                                                            *(undefined1 (*) [16])
                                                             (pauVar46[2] + 0x10),0xdd);
                                      auVar97 = ZEXT1664(auVar50);
                                    }
                                    auVar106 = auVar97._0_16_;
                                    auVar66 = auVar74._0_16_;
                                    auVar84 = auVar87._0_16_;
                                    auVar58 = auVar65._0_16_;
                                    auVar57 = auVar83._0_16_;
                                    auVar50 = auVar56._0_16_;
                                    if (0 < iVar28) {
                                      lVar10 = 0;
                                      do {
                                        uVar18 = *(undefined4 *)(*pauVar37 + lVar10 * 8);
                                        auVar117._4_4_ = uVar18;
                                        auVar117._0_4_ = uVar18;
                                        auVar117._8_4_ = uVar18;
                                        auVar117._12_4_ = uVar18;
                                        auVar50 = vfmadd231ps_fma(auVar56._0_16_,auVar117,*pauVar39)
                                        ;
                                        auVar56 = ZEXT1664(auVar50);
                                        auVar58 = vfmadd231ps_fma(auVar65._0_16_,auVar117,
                                                                  pauVar39[1]);
                                        auVar65 = ZEXT1664(auVar58);
                                        auVar66 = vfmadd231ps_fma(auVar74._0_16_,pauVar39[2],
                                                                  auVar117);
                                        auVar74 = ZEXT1664(auVar66);
                                        uVar18 = *(undefined4 *)(*pauVar37 + lVar10 * 8 + 4);
                                        auVar118._4_4_ = uVar18;
                                        auVar118._0_4_ = uVar18;
                                        auVar118._8_4_ = uVar18;
                                        auVar118._12_4_ = uVar18;
                                        auVar57 = vfmadd231ps_fma(auVar83._0_16_,auVar118,*pauVar39)
                                        ;
                                        auVar83 = ZEXT1664(auVar57);
                                        auVar84 = vfmadd231ps_fma(auVar87._0_16_,auVar118,
                                                                  pauVar39[1]);
                                        auVar87 = ZEXT1664(auVar84);
                                        auVar106 = vfmadd231ps_fma(auVar97._0_16_,auVar118,
                                                                   pauVar39[2]);
                                        auVar97 = ZEXT1664(auVar106);
                                        pauVar39 = pauVar39 + 3;
                                        lVar10 = lVar10 + 1;
                                      } while (uVar47 != (uint)lVar10);
                                    }
                                    if (iVar17 < iVar35) {
                                      auVar139 = vunpcklps_avx(auVar50,auVar57);
                                      auVar50 = vunpckhps_avx(auVar50,auVar57);
                                      auVar57 = vunpcklps_avx(auVar58,auVar84);
                                      auVar58 = vunpckhps_avx(auVar58,auVar84);
                                      auVar84 = vunpcklps_avx(auVar66,auVar106);
                                      auVar66 = vunpckhps_avx(auVar66,auVar106);
                                      *(undefined1 (*) [16])*pauVar46 = auVar139;
                                      *(undefined1 (*) [16])(*pauVar46 + 0x10) = auVar50;
                                      *(undefined1 (*) [16])pauVar46[1] = auVar57;
                                      *(undefined1 (*) [16])(pauVar46[1] + 0x10) = auVar58;
                                      *(undefined1 (*) [16])pauVar46[2] = auVar84;
                                      *(undefined1 (*) [16])(pauVar46[2] + 0x10) = auVar66;
                                    }
                                    else {
                                      *pauVar15 = auVar50;
                                      pauVar15[1] = auVar58;
                                      pauVar15[2] = auVar66;
                                      *(undefined1 (*) [16])(*pauVar15 + lVar31 * 4) = auVar57;
                                      *(undefined1 (*) [16])(pauVar15[1] + lVar31 * 4) = auVar84;
                                      *(undefined1 (*) [16])(pauVar15[2] + lVar31 * 4) = auVar106;
                                      pauVar15 = pauVar15 + 3;
                                    }
                                    pauVar46 = pauVar46 + 3;
                                    uVar9 = uVar25 + 0xc;
                                    iVar48 = uVar25 + 0x17;
                                    uVar25 = uVar9;
                                  } while (iVar48 < (int)uVar19);
                                }
                                iVar48 = uVar9 + 7;
                                while (iVar48 < (int)uVar19) {
                                  if (iVar29 == 0) {
                                    if (pauVar14 == (undefined1 (*) [32])0x0) {
                                      auVar56 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar65 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar74 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar83 = ZEXT1664(ZEXT816(0) << 0x40);
                                    }
                                    else {
                                      uVar18 = *(undefined4 *)*pauVar14;
                                      auVar52._4_4_ = uVar18;
                                      auVar52._0_4_ = uVar18;
                                      auVar52._8_4_ = uVar18;
                                      auVar52._12_4_ = uVar18;
                                      auVar56 = ZEXT1664(auVar52);
                                      uVar18 = *(undefined4 *)(*pauVar14 + 4);
                                      auVar67._4_4_ = uVar18;
                                      auVar67._0_4_ = uVar18;
                                      auVar67._8_4_ = uVar18;
                                      auVar67._12_4_ = uVar18;
                                      auVar74 = ZEXT1664(auVar67);
                                      auVar65 = ZEXT1664(auVar52);
                                      auVar83 = ZEXT1664(auVar67);
                                    }
                                  }
                                  else {
                                    auVar50 = vshufps_avx(*(undefined1 (*) [16])*pauVar46,
                                                          *(undefined1 (*) [16])(*pauVar46 + 0x10),
                                                          0x88);
                                    auVar56 = ZEXT1664(auVar50);
                                    auVar50 = vshufps_avx(*(undefined1 (*) [16])pauVar46[1],
                                                          *(undefined1 (*) [16])(pauVar46[1] + 0x10)
                                                          ,0x88);
                                    auVar65 = ZEXT1664(auVar50);
                                    auVar50 = vshufps_avx(*(undefined1 (*) [16])*pauVar46,
                                                          *(undefined1 (*) [16])(*pauVar46 + 0x10),
                                                          0xdd);
                                    auVar74 = ZEXT1664(auVar50);
                                    auVar50 = vshufps_avx(*(undefined1 (*) [16])pauVar46[1],
                                                          *(undefined1 (*) [16])(pauVar46[1] + 0x10)
                                                          ,0xdd);
                                    auVar83 = ZEXT1664(auVar50);
                                  }
                                  auVar57 = auVar83._0_16_;
                                  auVar58 = auVar65._0_16_;
                                  auVar66 = auVar74._0_16_;
                                  auVar50 = auVar56._0_16_;
                                  if (0 < iVar28) {
                                    lVar10 = 0;
                                    do {
                                      uVar18 = *(undefined4 *)(*pauVar37 + lVar10 * 8);
                                      auVar98._4_4_ = uVar18;
                                      auVar98._0_4_ = uVar18;
                                      auVar98._8_4_ = uVar18;
                                      auVar98._12_4_ = uVar18;
                                      auVar50 = vfmadd231ps_fma(auVar56._0_16_,auVar98,*pauVar39);
                                      auVar56 = ZEXT1664(auVar50);
                                      auVar58 = vfmadd231ps_fma(auVar65._0_16_,pauVar39[1],auVar98);
                                      auVar65 = ZEXT1664(auVar58);
                                      uVar18 = *(undefined4 *)(*pauVar37 + lVar10 * 8 + 4);
                                      auVar99._4_4_ = uVar18;
                                      auVar99._0_4_ = uVar18;
                                      auVar99._8_4_ = uVar18;
                                      auVar99._12_4_ = uVar18;
                                      auVar66 = vfmadd231ps_fma(auVar74._0_16_,auVar99,*pauVar39);
                                      auVar74 = ZEXT1664(auVar66);
                                      auVar57 = vfmadd231ps_fma(auVar83._0_16_,auVar99,pauVar39[1]);
                                      auVar83 = ZEXT1664(auVar57);
                                      pauVar39 = pauVar39 + 2;
                                      lVar10 = lVar10 + 1;
                                    } while (uVar47 != (uint)lVar10);
                                  }
                                  if (iVar17 < iVar35) {
                                    auVar84 = vunpcklps_avx(auVar50,auVar66);
                                    auVar50 = vunpckhps_avx(auVar50,auVar66);
                                    auVar66 = vunpcklps_avx(auVar58,auVar57);
                                    auVar58 = vunpckhps_avx(auVar58,auVar57);
                                    *(undefined1 (*) [16])*pauVar46 = auVar84;
                                    *(undefined1 (*) [16])(*pauVar46 + 0x10) = auVar50;
                                    *(undefined1 (*) [16])pauVar46[1] = auVar66;
                                    *(undefined1 (*) [16])(pauVar46[1] + 0x10) = auVar58;
                                  }
                                  else {
                                    *pauVar15 = auVar50;
                                    pauVar15[1] = auVar58;
                                    *(undefined1 (*) [16])(*pauVar15 + lVar31 * 4) = auVar66;
                                    *(undefined1 (*) [16])(pauVar15[1] + lVar31 * 4) = auVar57;
                                    pauVar15 = pauVar15 + 2;
                                  }
                                  pauVar46 = pauVar46 + 2;
                                  iVar48 = uVar9 + 0xf;
                                  uVar9 = uVar9 + 8;
                                }
                                auVar66._4_4_ = uVar9 | 3;
                                while ((int)auVar66._4_4_ < (int)uVar19) {
                                  if (iVar29 == 0) {
                                    if (pauVar14 == (undefined1 (*) [32])0x0) {
                                      auVar56 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar65 = ZEXT1664(ZEXT816(0) << 0x40);
                                    }
                                    else {
                                      uVar18 = *(undefined4 *)*pauVar14;
                                      auVar56 = ZEXT1664(CONCAT412(uVar18,CONCAT48(uVar18,CONCAT44(
                                                  uVar18,uVar18))));
                                      uVar18 = *(undefined4 *)(*pauVar14 + 4);
                                      auVar65 = ZEXT1664(CONCAT412(uVar18,CONCAT48(uVar18,CONCAT44(
                                                  uVar18,uVar18))));
                                    }
                                  }
                                  else {
                                    auVar50 = vshufps_avx(*(undefined1 (*) [16])*pauVar46,
                                                          *(undefined1 (*) [16])(*pauVar46 + 0x10),
                                                          0x88);
                                    auVar56 = ZEXT1664(auVar50);
                                    auVar50 = vshufps_avx(*(undefined1 (*) [16])*pauVar46,
                                                          *(undefined1 (*) [16])(*pauVar46 + 0x10),
                                                          0xdd);
                                    auVar65 = ZEXT1664(auVar50);
                                  }
                                  auVar58 = auVar65._0_16_;
                                  auVar50 = auVar56._0_16_;
                                  if (0 < iVar28) {
                                    lVar10 = 0;
                                    do {
                                      uVar18 = *(undefined4 *)(*pauVar37 + lVar10 * 8);
                                      auVar78._4_4_ = uVar18;
                                      auVar78._0_4_ = uVar18;
                                      auVar78._8_4_ = uVar18;
                                      auVar78._12_4_ = uVar18;
                                      auVar50 = vfmadd231ps_fma(auVar56._0_16_,*pauVar39,auVar78);
                                      auVar56 = ZEXT1664(auVar50);
                                      uVar18 = *(undefined4 *)(*pauVar37 + lVar10 * 8 + 4);
                                      auVar79._4_4_ = uVar18;
                                      auVar79._0_4_ = uVar18;
                                      auVar79._8_4_ = uVar18;
                                      auVar79._12_4_ = uVar18;
                                      auVar58 = vfmadd231ps_fma(auVar65._0_16_,*pauVar39,auVar79);
                                      auVar65 = ZEXT1664(auVar58);
                                      pauVar39 = pauVar39 + 1;
                                      lVar10 = lVar10 + 1;
                                    } while (uVar47 != (uint)lVar10);
                                  }
                                  if (iVar17 < iVar35) {
                                    auVar66 = vunpcklps_avx(auVar50,auVar58);
                                    auVar50 = vunpckhps_avx(auVar50,auVar58);
                                    *(undefined1 (*) [16])*pauVar46 = auVar66;
                                    *(undefined1 (*) [16])(*pauVar46 + 0x10) = auVar50;
                                  }
                                  else {
                                    *pauVar15 = auVar50;
                                    *(undefined1 (*) [16])(*pauVar15 + lVar31 * 4) = auVar58;
                                    pauVar15 = pauVar15 + 1;
                                  }
                                  pauVar46 = pauVar46 + 1;
                                  auVar66._4_4_ = uVar9 + 7;
                                  uVar9 = uVar9 + 4;
                                }
                                auVar66._4_4_ = uVar9 | 1;
                                while ((int)auVar66._4_4_ < (int)uVar19) {
                                  if (iVar29 == 0) {
                                    if (pauVar14 == (undefined1 (*) [32])0x0) {
                                      auVar56 = ZEXT1664(ZEXT816(0) << 0x40);
                                    }
                                    else {
                                      auVar56 = ZEXT1664(CONCAT88(*(undefined8 *)*pauVar14,
                                                                  *(undefined8 *)*pauVar14));
                                    }
                                  }
                                  else {
                                    auVar56 = ZEXT1664(*(undefined1 (*) [16])*pauVar46);
                                  }
                                  auVar50 = auVar56._0_16_;
                                  if (0 < iVar28) {
                                    lVar10 = 0;
                                    lVar24 = 0;
                                    do {
                                      auVar60._8_8_ = *(undefined8 *)(*pauVar37 + lVar24 * 8);
                                      auVar60._0_8_ = *(undefined8 *)(*pauVar37 + lVar24 * 8);
                                      auVar68._8_8_ = 0;
                                      auVar68._0_8_ = *(ulong *)(*pauVar39 + lVar24 * 8);
                                      auVar50 = vshufps_avx(auVar68,auVar68,0x50);
                                      auVar50 = vfmadd231ps_fma(auVar56._0_16_,auVar60,auVar50);
                                      auVar56 = ZEXT1664(auVar50);
                                      lVar24 = lVar24 + 1;
                                      lVar10 = lVar10 + -8;
                                    } while (uVar47 != (uint)lVar24);
                                    pauVar39 = (undefined1 (*) [16])((long)pauVar39 - lVar10);
                                  }
                                  if (iVar17 < iVar35) {
                                    *(undefined1 (*) [16])*pauVar46 = auVar50;
                                  }
                                  else {
                                    auVar58 = vshufps_avx(auVar50,auVar50,0xe8);
                                    uVar1 = vmovlps_avx(auVar58);
                                    *(undefined8 *)*pauVar15 = uVar1;
                                    uVar18 = vextractps_avx(auVar50,1);
                                    *(undefined4 *)(*pauVar15 + lVar31 * 4) = uVar18;
                                    uVar18 = vextractps_avx(auVar50,3);
                                    *(undefined4 *)
                                     (*pauVar15 +
                                     ((long)((local_90 << 0x20) + 0x100000000) >> 0x20) * 4) =
                                         uVar18;
                                    pauVar15 = (undefined1 (*) [16])(*pauVar15 + 8);
                                  }
                                  pauVar46 = (undefined1 (*) [32])(*pauVar46 + 0x10);
                                  auVar66._4_4_ = uVar9 + 3;
                                  uVar9 = uVar9 + 2;
                                }
                                if ((int)uVar9 < (int)uVar19) {
                                  do {
                                    auVar53 = ZEXT816(0) << 0x40;
                                    if (pauVar14 != (undefined1 (*) [32])0x0 || iVar29 != 0) {
                                      pauVar26 = pauVar27;
                                      if (iVar29 != 0) {
                                        pauVar26 = pauVar46;
                                      }
                                      auVar53._8_8_ = 0;
                                      auVar53._0_8_ = *(ulong *)*pauVar26;
                                    }
                                    if (0 < iVar28) {
                                      lVar10 = 0;
                                      do {
                                        auVar61._8_8_ = 0;
                                        auVar61._0_8_ = *(ulong *)(*pauVar37 + lVar10 * 8);
                                        uVar18 = *(undefined4 *)*pauVar39;
                                        auVar69._4_4_ = uVar18;
                                        auVar69._0_4_ = uVar18;
                                        auVar69._8_4_ = uVar18;
                                        auVar69._12_4_ = uVar18;
                                        auVar53 = vfmadd231ps_fma(auVar53,auVar61,auVar69);
                                        pauVar39 = (undefined1 (*) [16])(*pauVar39 + 4);
                                        lVar10 = lVar10 + 1;
                                      } while (uVar47 != (uint)lVar10);
                                    }
                                    if (iVar17 < iVar35) {
                                      uVar1 = vmovlps_avx(auVar53);
                                      *(undefined8 *)*pauVar46 = uVar1;
                                    }
                                    else {
                                      *(int *)*pauVar15 = auVar53._0_4_;
                                      uVar18 = vextractps_avx(auVar53,1);
                                      *(undefined4 *)(*pauVar15 + lVar31 * 4) = uVar18;
                                      pauVar15 = (undefined1 (*) [16])(*pauVar15 + 4);
                                    }
                                    pauVar46 = (undefined1 (*) [32])(*pauVar46 + 8);
                                    uVar9 = uVar9 + 1;
                                  } while (uVar9 != uVar19);
                                }
                                pauVar37 = (undefined1 (*) [32])(*pauVar37 + (long)(iVar28 * 2) * 4)
                                ;
                                uVar23 = uVar36 + 2;
                                lVar10 = uVar36 + 3;
                                uVar36 = uVar23;
                              } while (lVar10 < local_128);
                            }
                            if ((int)uVar23 < (int)uVar44) {
                              lVar31 = (long)(int)uVar23;
                              do {
                                pauVar27 = (undefined1 (*) [32])
                                           ((long)(this->super_Convolution).bias_data.data +
                                           lVar31 * 4 + local_190 * 4);
                                if (pauVar14 == (undefined1 (*) [32])0x0) {
                                  pauVar27 = pauVar14;
                                }
                                auVar66._4_4_ = 0;
                                pauVar15 = (undefined1 (*) [16])
                                           ((long)local_1d0->data +
                                           local_58 * 4 + (lVar31 + local_190) * (long)iVar22 * 4);
                                pauVar39 = local_1d8;
                                if (0xb < (int)uVar19) {
                                  uVar9 = 0;
                                  do {
                                    if (iVar29 == 0) {
                                      if (pauVar27 == (undefined1 (*) [32])0x0) {
                                        auVar56 = ZEXT1664(ZEXT816(0) << 0x40);
                                        auVar65 = ZEXT1664(ZEXT816(0) << 0x40);
                                        auVar74 = ZEXT1664(ZEXT816(0) << 0x40);
                                      }
                                      else {
                                        uVar18 = *(undefined4 *)*pauVar27;
                                        auVar54._4_4_ = uVar18;
                                        auVar54._0_4_ = uVar18;
                                        auVar54._8_4_ = uVar18;
                                        auVar54._12_4_ = uVar18;
                                        auVar56 = ZEXT1664(auVar54);
                                        auVar65 = ZEXT1664(auVar54);
                                        auVar74 = ZEXT1664(auVar54);
                                      }
                                    }
                                    else {
                                      auVar56 = ZEXT1664(*(undefined1 (*) [16])*pauVar46);
                                      auVar65 = ZEXT1664(*(undefined1 (*) [16])(*pauVar46 + 0x10));
                                      auVar74 = ZEXT1664(*(undefined1 (*) [16])pauVar46[1]);
                                    }
                                    auVar66 = auVar74._0_16_;
                                    auVar58 = auVar65._0_16_;
                                    auVar50 = auVar56._0_16_;
                                    if (0 < iVar28) {
                                      lVar10 = 0;
                                      do {
                                        uVar18 = *(undefined4 *)(*pauVar37 + lVar10 * 4);
                                        auVar80._4_4_ = uVar18;
                                        auVar80._0_4_ = uVar18;
                                        auVar80._8_4_ = uVar18;
                                        auVar80._12_4_ = uVar18;
                                        auVar50 = vfmadd231ps_fma(auVar56._0_16_,auVar80,*pauVar39);
                                        auVar56 = ZEXT1664(auVar50);
                                        auVar58 = vfmadd231ps_fma(auVar65._0_16_,auVar80,pauVar39[1]
                                                                 );
                                        auVar65 = ZEXT1664(auVar58);
                                        auVar66 = vfmadd231ps_fma(auVar74._0_16_,auVar80,pauVar39[2]
                                                                 );
                                        auVar74 = ZEXT1664(auVar66);
                                        pauVar39 = pauVar39 + 3;
                                        lVar10 = lVar10 + 1;
                                      } while (iVar28 != (int)lVar10);
                                    }
                                    if (iVar17 < iVar35) {
                                      *(undefined1 (*) [16])*pauVar46 = auVar50;
                                      *(undefined1 (*) [16])(*pauVar46 + 0x10) = auVar58;
                                      *(undefined1 (*) [16])pauVar46[1] = auVar66;
                                    }
                                    else {
                                      *pauVar15 = auVar50;
                                      pauVar15[1] = auVar58;
                                      pauVar15[2] = auVar66;
                                      pauVar15 = pauVar15 + 3;
                                    }
                                    pauVar46 = (undefined1 (*) [32])(pauVar46[1] + 0x10);
                                    auVar66._4_4_ = uVar9 + 0xc;
                                    iVar48 = uVar9 + 0x17;
                                    uVar9 = auVar66._4_4_;
                                  } while (iVar48 < (int)uVar19);
                                }
                                iVar48 = auVar66._4_4_ + 7;
                                while (iVar48 < (int)uVar19) {
                                  if (iVar29 == 0) {
                                    if (pauVar27 == (undefined1 (*) [32])0x0) {
                                      auVar56 = ZEXT1664(ZEXT816(0) << 0x40);
                                      auVar65 = ZEXT1664(ZEXT816(0) << 0x40);
                                    }
                                    else {
                                      uVar18 = *(undefined4 *)*pauVar27;
                                      auVar55._4_4_ = uVar18;
                                      auVar55._0_4_ = uVar18;
                                      auVar55._8_4_ = uVar18;
                                      auVar55._12_4_ = uVar18;
                                      auVar56 = ZEXT1664(auVar55);
                                      auVar65 = ZEXT1664(auVar55);
                                    }
                                  }
                                  else {
                                    auVar56 = ZEXT1664(*(undefined1 (*) [16])*pauVar46);
                                    auVar65 = ZEXT1664(*(undefined1 (*) [16])(*pauVar46 + 0x10));
                                  }
                                  auVar58 = auVar65._0_16_;
                                  auVar50 = auVar56._0_16_;
                                  if (0 < iVar28) {
                                    lVar10 = 0;
                                    do {
                                      uVar18 = *(undefined4 *)(*pauVar37 + lVar10 * 4);
                                      auVar70._4_4_ = uVar18;
                                      auVar70._0_4_ = uVar18;
                                      auVar70._8_4_ = uVar18;
                                      auVar70._12_4_ = uVar18;
                                      auVar50 = vfmadd231ps_fma(auVar56._0_16_,auVar70,*pauVar39);
                                      auVar56 = ZEXT1664(auVar50);
                                      auVar58 = vfmadd231ps_fma(auVar65._0_16_,auVar70,pauVar39[1]);
                                      auVar65 = ZEXT1664(auVar58);
                                      pauVar39 = pauVar39 + 2;
                                      lVar10 = lVar10 + 1;
                                    } while (iVar28 != (int)lVar10);
                                  }
                                  if (iVar17 < iVar35) {
                                    *(undefined1 (*) [16])*pauVar46 = auVar50;
                                    *(undefined1 (*) [16])(*pauVar46 + 0x10) = auVar58;
                                  }
                                  else {
                                    *pauVar15 = auVar50;
                                    pauVar15[1] = auVar58;
                                    pauVar15 = pauVar15 + 2;
                                  }
                                  pauVar46 = pauVar46 + 1;
                                  iVar48 = auVar66._4_4_ + 0xf;
                                  auVar66._4_4_ = auVar66._4_4_ + 8;
                                }
                                auVar66._12_4_ = auVar66._4_4_ | 3;
                                while ((int)auVar66._12_4_ < (int)uVar19) {
                                  if (iVar29 == 0) {
                                    if (pauVar27 == (undefined1 (*) [32])0x0) {
                                      auVar56 = ZEXT1664(ZEXT816(0) << 0x40);
                                    }
                                    else {
                                      uVar18 = *(undefined4 *)*pauVar27;
                                      auVar56 = ZEXT1664(CONCAT412(uVar18,CONCAT48(uVar18,CONCAT44(
                                                  uVar18,uVar18))));
                                    }
                                  }
                                  else {
                                    auVar56 = ZEXT1664(*(undefined1 (*) [16])*pauVar46);
                                  }
                                  auVar50 = auVar56._0_16_;
                                  if (0 < iVar28) {
                                    lVar10 = 0;
                                    do {
                                      uVar18 = *(undefined4 *)(*pauVar37 + lVar10 * 4);
                                      auVar62._4_4_ = uVar18;
                                      auVar62._0_4_ = uVar18;
                                      auVar62._8_4_ = uVar18;
                                      auVar62._12_4_ = uVar18;
                                      auVar50 = vfmadd231ps_fma(auVar56._0_16_,auVar62,*pauVar39);
                                      auVar56 = ZEXT1664(auVar50);
                                      pauVar39 = pauVar39 + 1;
                                      lVar10 = lVar10 + 1;
                                    } while (iVar28 != (int)lVar10);
                                  }
                                  if (iVar17 < iVar35) {
                                    *(undefined1 (*) [16])*pauVar46 = auVar50;
                                  }
                                  else {
                                    *pauVar15 = auVar50;
                                    pauVar15 = pauVar15 + 1;
                                  }
                                  pauVar46 = (undefined1 (*) [32])(*pauVar46 + 0x10);
                                  auVar66._12_4_ = auVar66._4_4_ + 7;
                                  auVar66._4_4_ = auVar66._4_4_ + 4;
                                }
                                auVar66._12_4_ = auVar66._4_4_ | 1;
                                while ((int)auVar66._12_4_ < (int)uVar19) {
                                  if (iVar29 == 0) {
                                    if (pauVar27 == (undefined1 (*) [32])0x0) {
                                      auVar56 = ZEXT1664(ZEXT816(0) << 0x40);
                                    }
                                    else {
                                      uVar18 = *(undefined4 *)*pauVar27;
                                      auVar56 = ZEXT1664(CONCAT412(uVar18,CONCAT48(uVar18,CONCAT44(
                                                  uVar18,uVar18))));
                                    }
                                  }
                                  else {
                                    auVar56 = ZEXT864(*(ulong *)*pauVar46);
                                  }
                                  auVar50 = auVar56._0_16_;
                                  if (0 < iVar28) {
                                    lVar10 = 0;
                                    lVar24 = 0;
                                    do {
                                      auVar63._8_8_ = 0;
                                      auVar63._0_8_ = *(ulong *)(*pauVar39 + lVar24 * 8);
                                      uVar18 = *(undefined4 *)(*pauVar37 + lVar24 * 4);
                                      auVar71._4_4_ = uVar18;
                                      auVar71._0_4_ = uVar18;
                                      auVar71._8_4_ = uVar18;
                                      auVar71._12_4_ = uVar18;
                                      auVar50 = vfmadd231ps_fma(auVar56._0_16_,auVar63,auVar71);
                                      auVar56 = ZEXT1664(auVar50);
                                      lVar24 = lVar24 + 1;
                                      lVar10 = lVar10 + -8;
                                    } while (iVar28 != (int)lVar24);
                                    pauVar39 = (undefined1 (*) [16])((long)pauVar39 - lVar10);
                                  }
                                  if (iVar17 < iVar35) {
                                    uVar1 = vmovlps_avx(auVar50);
                                    *(undefined8 *)*pauVar46 = uVar1;
                                  }
                                  else {
                                    uVar1 = vmovlps_avx(auVar50);
                                    *(undefined8 *)*pauVar15 = uVar1;
                                    pauVar15 = (undefined1 (*) [16])(*pauVar15 + 8);
                                  }
                                  pauVar46 = (undefined1 (*) [32])(*pauVar46 + 8);
                                  auVar66._12_4_ = auVar66._4_4_ + 3;
                                  auVar66._4_4_ = auVar66._4_4_ + 2;
                                }
                                if ((int)auVar66._4_4_ < (int)uVar19) {
                                  do {
                                    auVar56 = ZEXT1664(ZEXT816(0) << 0x40);
                                    if (pauVar27 != (undefined1 (*) [32])0x0 || iVar29 != 0) {
                                      pauVar14 = pauVar27;
                                      if (iVar29 != 0) {
                                        pauVar14 = pauVar46;
                                      }
                                      auVar56 = ZEXT464(*(uint *)*pauVar14);
                                    }
                                    if (0 < iVar28) {
                                      lVar10 = 0;
                                      do {
                                        auVar50 = vfmadd231ss_fma(auVar56._0_16_,
                                                                  ZEXT416(*(uint *)*pauVar39),
                                                                  ZEXT416(*(uint *)(*pauVar37 +
                                                                                   lVar10 * 4)));
                                        auVar56 = ZEXT1664(auVar50);
                                        pauVar39 = (undefined1 (*) [16])(*pauVar39 + 4);
                                        lVar10 = lVar10 + 1;
                                      } while (iVar28 != (int)lVar10);
                                    }
                                    if (iVar17 < iVar35) {
                                      *(int *)*pauVar46 = auVar56._0_4_;
                                    }
                                    else {
                                      *(int *)*pauVar15 = auVar56._0_4_;
                                      pauVar15 = (undefined1 (*) [16])(*pauVar15 + 4);
                                    }
                                    pauVar46 = (undefined1 (*) [32])(*pauVar46 + 4);
                                    auVar66._4_4_ = auVar66._4_4_ + 1;
                                  } while (auVar66._4_4_ != uVar19);
                                }
                                lVar31 = lVar31 + 1;
                                pauVar37 = (undefined1 (*) [32])(*pauVar37 + (long)iVar28 * 4);
                                pauVar14 = pauVar27;
                              } while (lVar31 != local_128);
                            }
                            local_1b0 = (ulong)(uint)TILE_K;
                            uVar36 = (ulong)(uint)(iVar29 + TILE_K);
                            pMVar21 = local_1d0;
                            uVar9 = TILE_N;
                            local_1a4 = iVar45;
                          } while (iVar29 + TILE_K < iVar35);
                        }
                        iVar45 = iVar45 + uVar9;
                        local_1bc = uVar44;
                        local_60 = iVar43;
                        local_50 = (ulong)uVar44;
                      } while (iVar45 < iVar7);
                    }
                    auVar66._4_4_ = (int)local_a8 + 1;
                    local_a8 = (ulong)auVar66._4_4_;
                    uVar16 = local_198;
                  } while (auVar66._4_4_ != local_120);
                }
                iVar7 = 0;
              }
              piVar13 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
              if (piVar13 != (int *)0x0) {
                LOCK();
                *piVar13 = *piVar13 + -1;
                UNLOCK();
                if (*piVar13 == 0) {
                  if (local_118.allocator == (Allocator *)0x0) {
                    if (local_118.data != (void *)0x0) {
                      free(local_118.data);
                    }
                  }
                  else {
                    (*(local_118.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
            }
            piVar13 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
            if (piVar13 != (int *)0x0) {
              LOCK();
              *piVar13 = *piVar13 + -1;
              UNLOCK();
              if (*piVar13 == 0) {
                if (local_188.allocator == (Allocator *)0x0) {
                  if (local_188.data != (void *)0x0) {
                    free(local_188.data);
                  }
                }
                else {
                  (*(local_188.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            if (iVar7 == 0) {
              pLVar32 = this->activation;
              iVar7 = 0;
              if (pLVar32 != (Layer *)0x0) {
                (*pLVar32->_vptr_Layer[9])(pLVar32,pMVar21,opt);
              }
            }
          }
        }
      }
    }
LAB_001cdd69:
    piVar13 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
    if (piVar13 == (int *)0x0) {
      return iVar7;
    }
    LOCK();
    *piVar13 = *piVar13 + -1;
    UNLOCK();
    if (*piVar13 != 0) {
      return iVar7;
    }
    if (local_228.allocator != (Allocator *)0x0) {
      (*(local_228.allocator)->_vptr_Allocator[3])();
      return iVar7;
    }
    local_228.allocator = (Allocator *)0x0;
    __ptr = local_228.data;
    goto joined_r0x001cde04;
  }
  local_188.cstep = 0;
  local_188.data = (void *)0x0;
  local_188.refcount._0_4_ = 0;
  local_188.refcount._4_4_ = 0;
  local_188.elemsize = 0;
  local_188.elempack = 0;
  local_188.allocator = (Allocator *)0x0;
  local_188.dims = 0;
  local_188.w = 0;
  local_188.h = 0;
  local_188.d = 0;
  local_188.c = 0;
  if ((bottom_blob->elemsize & 0xf) == 0) {
    if (&local_188 == bottom_blob) {
      local_188.c = bottom_blob->w;
    }
    else {
      piVar13 = bottom_blob->refcount;
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + 1;
        UNLOCK();
      }
      local_188.data = bottom_blob->data;
      local_188.refcount._0_4_ = SUB84(bottom_blob->refcount,0);
      local_188.refcount._4_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
      local_188.elemsize = bottom_blob->elemsize;
      local_188.elempack = bottom_blob->elempack;
      local_188.allocator = bottom_blob->allocator;
      local_188.c = bottom_blob->w;
      local_188.d = bottom_blob->d;
    }
    local_188.dims = 3;
    local_188.w = 1;
    local_188.h = 1;
    local_188.cstep = 1;
LAB_001d1749:
    local_118.cstep = 0;
    local_118.data = (void *)0x0;
    local_118.refcount._0_4_ = 0;
    local_118.refcount._4_4_ = 0;
    local_118.elemsize._0_1_ = 0;
    local_118.elemsize._1_7_ = 0;
    local_118.elempack = 0;
    local_118.allocator = (Allocator *)0x0;
    local_118.dims = 0;
    local_118.w = 0;
    local_118.h = 0;
    local_118.d = 0;
    local_118.c = 0;
    iVar7 = (*(this->super_Convolution).super_Layer._vptr_Layer[7])(this,&local_188,&local_118,opt);
    if (iVar7 == 0) {
      if (((byte)local_118.elemsize & 0xf) == 0) {
        if (&local_118 != top_blob) {
          piVar13 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
          if (piVar13 != (int *)0x0) {
            LOCK();
            *piVar13 = *piVar13 + 1;
            UNLOCK();
          }
          piVar13 = top_blob->refcount;
          if (piVar13 != (int *)0x0) {
            LOCK();
            *piVar13 = *piVar13 + -1;
            UNLOCK();
            if (*piVar13 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_118.data;
          top_blob->refcount = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
          top_blob->elemsize = CONCAT71(local_118.elemsize._1_7_,(byte)local_118.elemsize);
          top_blob->elempack = local_118.elempack;
          top_blob->allocator = local_118.allocator;
          top_blob->dims = local_118.dims;
          top_blob->w = local_118.w;
          top_blob->h = local_118.h;
          top_blob->d = local_118.d;
          top_blob->c = local_118.c;
          top_blob->cstep = local_118.cstep;
        }
        top_blob->dims = 1;
        top_blob->w = local_118.c;
        top_blob->h = 1;
        top_blob->c = 1;
        local_188.cstep = (size_t)local_118.c;
      }
      else {
        Mat::reshape(&local_228,&local_118,local_118.c,opt->blob_allocator);
        piVar13 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
        if (&local_228 != top_blob) {
          if (piVar13 != (int *)0x0) {
            LOCK();
            *piVar13 = *piVar13 + 1;
            UNLOCK();
          }
          piVar13 = top_blob->refcount;
          if (piVar13 != (int *)0x0) {
            LOCK();
            *piVar13 = *piVar13 + -1;
            UNLOCK();
            if (*piVar13 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          piVar13 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
          top_blob->data = local_228.data;
          top_blob->refcount = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
          top_blob->elemsize = local_228.elemsize;
          top_blob->elempack = local_228.elempack;
          top_blob->allocator = local_228.allocator;
          top_blob->dims = local_228.dims;
          top_blob->w = local_228.w;
          top_blob->h = local_228.h;
          top_blob->d = local_228.d;
          top_blob->c = local_228.c;
          top_blob->cstep = local_228.cstep;
        }
        if (piVar13 != (int *)0x0) {
          LOCK();
          *piVar13 = *piVar13 + -1;
          UNLOCK();
          if (*piVar13 == 0) {
            if (local_228.allocator == (Allocator *)0x0) {
              if (local_228.data != (void *)0x0) {
                free(local_228.data);
              }
            }
            else {
              (*(local_228.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        iVar7 = -100;
        if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
        goto LAB_001d19de;
      }
      iVar7 = 0;
    }
LAB_001d19de:
    piVar13 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 == 0) {
        if (local_118.allocator == (Allocator *)0x0) {
          if (local_118.data != (void *)0x0) {
            free(local_118.data);
          }
        }
        else {
          (*(local_118.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    Mat::reshape(&local_118,bottom_blob,1,1,bottom_blob->w,opt->workspace_allocator);
    piVar13 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + 1;
      UNLOCK();
    }
    piVar13 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 == 0) {
        if (local_188.allocator == (Allocator *)0x0) {
          if (local_188.data != (void *)0x0) {
            free(local_188.data);
          }
        }
        else {
          (*(local_188.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar13 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
    local_188.data = local_118.data;
    local_188.refcount._0_4_ = local_118.refcount._0_4_;
    local_188.refcount._4_4_ = local_118.refcount._4_4_;
    local_188.elemsize = CONCAT71(local_118.elemsize._1_7_,(byte)local_118.elemsize);
    local_188.elempack = local_118.elempack;
    local_188.allocator = local_118.allocator;
    local_188.dims = local_118.dims;
    local_188.w = local_118.w;
    local_188.h = local_118.h;
    local_188.d = local_118.d;
    local_188.c = local_118.c;
    local_188.cstep = local_118.cstep;
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 == 0) {
        if (local_118.allocator == (Allocator *)0x0) {
          if (local_118.data != (void *)0x0) {
            free(local_118.data);
          }
        }
        else {
          (*(local_118.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar7 = -100;
    if ((local_188.data != (void *)0x0) && ((long)local_188.c * local_188.cstep != 0))
    goto LAB_001d1749;
  }
  piVar13 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
  if (piVar13 == (int *)0x0) {
    return iVar7;
  }
  LOCK();
  *piVar13 = *piVar13 + -1;
  UNLOCK();
  if (*piVar13 != 0) {
    return iVar7;
  }
  if (local_188.allocator != (Allocator *)0x0) {
    (*(local_188.allocator)->_vptr_Allocator[3])();
    return iVar7;
  }
  local_188.allocator = (Allocator *)0x0;
  __ptr = local_188.data;
joined_r0x001cde04:
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  return iVar7;
}

Assistant:

int Convolution_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

    // flattened blob, implement as InnerProduct
    if (bottom_blob.dims == 1 && kernel_w == 1 && kernel_h == 1)
    {
        Mat bottom_blob_3d;
        if (bottom_blob.elemsize % 16 == 0)
        {
            bottom_blob_3d = bottom_blob;
            bottom_blob_3d.dims = 3;
            bottom_blob_3d.w = 1;
            bottom_blob_3d.h = 1;
            bottom_blob_3d.c = bottom_blob.w;
            bottom_blob_3d.cstep = 1;
        }
        else
        {
            bottom_blob_3d = bottom_blob.reshape(1, 1, bottom_blob.w, opt.workspace_allocator);
            if (bottom_blob_3d.empty())
                return -100;
        }

        Mat top_blob_3d;
        int ret = forward(bottom_blob_3d, top_blob_3d, opt);
        if (ret != 0)
            return ret;

        if (top_blob_3d.elemsize % 16 == 0)
        {
            top_blob = top_blob_3d;
            top_blob.dims = 1;
            top_blob.w = top_blob_3d.c;
            top_blob.h = 1;
            top_blob.c = 1;
            bottom_blob_3d.cstep = top_blob_3d.c;
        }
        else
        {
            top_blob = top_blob_3d.reshape(top_blob_3d.c, opt.blob_allocator);
            if (top_blob.empty())
                return -100;
        }

        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (!opt.use_packing_layout && kernel_w == kernel_h && dilation_w != 1 && dilation_h == dilation_w && stride_w == 1 && stride_h == 1)
    {
        if (outw >= dilation_w && outh >= dilation_h)
        {
            return forwardDilation_x86(bottom_blob_bordered, top_blob, opt);
        }
    }

    const int num_input = channels * elempack;

    bool prefer_winograd = (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && (num_input > 8 || num_output > 8);

    if (opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        bool prefer_winograd63 = test_prefer_winograd63(num_input, num_output, w, h);
        bool prefer_winograd23 = test_prefer_winograd23(num_input, num_output, w, h);
        bool prefer_winograd43 = !prefer_winograd63 && !prefer_winograd23;

        if (prefer_winograd23 && (!opt.use_winograd23_convolution || weight_winograd23_data.empty()))
        {
            // f23 fallback to f43
            prefer_winograd23 = false;
            prefer_winograd43 = true;
        }

        if (prefer_winograd63 && (!opt.use_winograd63_convolution || weight_winograd63_data.empty()))
        {
            // f63 fallback to f43
            prefer_winograd63 = false;
            prefer_winograd43 = true;
        }

        if (prefer_winograd43 && (!opt.use_winograd43_convolution || weight_winograd43_data.empty()))
        {
            // f43 fallback to f63 or f23
            prefer_winograd43 = false;
            if (opt.use_winograd63_convolution && !weight_winograd63_data.empty())
            {
                prefer_winograd63 = true;
            }
            else
            {
                prefer_winograd23 = true;
            }
        }

        int _nT = nT ? nT : opt.num_threads;
        if (nT != 0 && opt.num_threads != nT)
        {
            // force num_threads the same as in create_pipeline
            // so we could use pre-packed A/B from the same tile config
            NCNN_LOGE("opt.num_threads %d changed, convolution winograd will use load-time value %d", opt.num_threads, nT);
        }

        int ret = 0;
        if (prefer_winograd23)
        {
            ret = conv3x3s1_winograd23(bottom_blob_bordered, top_blob, weight_winograd23_data, bias_data, _nT, opt);
        }
        else if (prefer_winograd43)
        {
            ret = conv3x3s1_winograd43(bottom_blob_bordered, top_blob, weight_winograd43_data, bias_data, _nT, opt);
        }
        else if (prefer_winograd63)
        {
            ret = conv3x3s1_winograd63(bottom_blob_bordered, top_blob, weight_winograd63_data, bias_data, _nT, opt);
        }
        else
        {
            // should never reach here
        }
        if (ret != 0)
            return ret;

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
        return 0;
    }

    int l2_cache_size = get_cpu_level2_cache_size();
    bool prefer_sgemm = num_input * num_output * kernel_w * kernel_h * dilation_w * dilation_h * stride_w * stride_h * (int)sizeof(float) * 2 > l2_cache_size || (num_input > 16 || num_output > 16);

    if ((opt.use_sgemm_convolution && prefer_sgemm) || (kernel_w == 1 && kernel_h == 1))
    {
        int _nT = nT ? nT : opt.num_threads;
        if (nT != 0 && opt.num_threads != nT)
        {
            // force num_threads the same as in create_pipeline
            // so we could use pre-packed A/B from the same tile config
            NCNN_LOGE("opt.num_threads %d changed, convolution gemm will use load-time value %d", opt.num_threads, nT);
        }

        int ret = convolution_im2col_gemm(bottom_blob_bordered, top_blob, weight_sgemm_data, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, _nT, opt);
        if (ret != 0)
            return ret;

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
        return 0;
    }

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16 && out_elempack == 1)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack16to1_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }
#endif // __AVX512F__

    if (elempack == 8 && out_elempack == 8)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
        if (kernel_w == 2 && kernel_h == 2 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv2x2s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }

    if (elempack == 1 && out_elempack == 8)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack1to8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv3x3s2_pack1to8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack8to1_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }
#endif // __AVX__

    if (elempack == 1 && out_elempack == 4)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack1to4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv3x3s2_pack1to4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }
#endif // __SSE2__

    convolution_packed(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);

    return 0;
}